

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  Split *pSVar3;
  HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_2UL>
  *pHVar4;
  int iVar5;
  undefined4 uVar6;
  __base_type _Var7;
  MemoryMonitorInterface *pMVar8;
  NodeRefPtr<4> this_00;
  ThreadLocal2 *pTVar9;
  iterator iVar10;
  BBox1f *pBVar11;
  PrimRefMB *pPVar12;
  Scene *pSVar13;
  Geometry *pGVar14;
  long lVar15;
  long lVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  vuint<4> vVar24;
  vint *pvVar25;
  unsigned_long uVar26;
  unsigned_long uVar27;
  BBox1f BVar28;
  char cVar29;
  long lVar30;
  long lVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *this_01;
  void *pvVar32;
  ulong uVar33;
  size_t sVar34;
  undefined8 *puVar35;
  runtime_error *prVar36;
  BBox1f *pBVar37;
  long lVar38;
  BBox1f BVar39;
  uint *puVar40;
  ulong uVar41;
  long *plVar42;
  float *pfVar43;
  __pointer_type *ppBVar44;
  __pointer_type pBVar45;
  char *pcVar46;
  ulong uVar47;
  byte bVar48;
  BuildRecord *in_00;
  long lVar49;
  uint uVar50;
  undefined8 uVar51;
  long lVar52;
  byte bVar53;
  size_t i;
  PrimRefMB *pPVar54;
  uint uVar55;
  __pointer_type pBVar56;
  code *pcVar57;
  ulong uVar58;
  mvector<PrimRefMB> *prims;
  long lVar59;
  ulong uVar60;
  bool bVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined8 uVar72;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar90;
  float fVar91;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar92;
  undefined1 auVar89 [16];
  float fVar93;
  float fVar97;
  float fVar98;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar99;
  undefined1 auVar96 [16];
  undefined1 auVar100 [16];
  float fVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar107;
  float fVar110;
  float fVar111;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar112;
  float fVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar122;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar123;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
  *pBVar135;
  BBox1f local_1e50;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1e48;
  undefined1 local_1e38 [8];
  float fStack_1e30;
  float fStack_1e2c;
  BuildRecord *local_1e20;
  undefined1 local_1e18 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e08;
  undefined1 local_1df8 [16];
  NodeRecordMB4D *local_1de0;
  BBox1f time_range1;
  BBox1f time_range0;
  undefined1 local_1dc8 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1db8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1da8;
  PrimRefVector lprims;
  PrimInfoMB right;
  PrimInfoMB left;
  anon_class_1_0_00000001 reduction;
  undefined4 local_1c28;
  vuint<4> v2;
  undefined1 local_1c08 [16];
  undefined1 auStack_1bf8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1be8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1bd8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bc8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1bb8;
  __pointer_type local_1ba8;
  __pointer_type pBStack_1ba0;
  size_t sStack_1b98;
  size_t sStack_1b90;
  undefined1 auStack_1b88 [16];
  BBox1f local_1b78;
  PrimRef *local_1b68;
  undefined8 uStack_1b60;
  longlong local_1b58;
  longlong local_1b48;
  longlong lStack_1b40;
  longlong lStack_1b38;
  longlong lStack_1b30;
  vuint<4> geomID;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b18;
  undefined8 uStack_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 uStack_1ac0;
  __pointer_type local_1ab8;
  __pointer_type pBStack_1ab0;
  __pointer_type pBStack_1aa8;
  __pointer_type pBStack_1aa0;
  undefined1 auStack_1a98 [16];
  BBox1f local_1a88;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 uStack_1a40;
  long local_1a38;
  undefined8 uStack_1a30;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19d8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  BuildRecordSplit current;
  vuint<4> v0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17a8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1798;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1788;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1768;
  __pointer_type local_1758;
  atomic<embree::FastAllocator::Block_*> aStack_1750;
  size_t sStack_1748;
  size_t sStack_1740;
  BBox1f local_1738;
  float fStack_1730;
  uint uStack_172c;
  BBox1f local_1728 [2];
  undefined1 local_1718 [8];
  size_t sStack_1710;
  int local_1708;
  int aiStack_1704 [3];
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16e8 [226];
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  undefined8 local_838 [14];
  BBox1f aBStack_7c8 [49];
  long local_640;
  NodeRecordMB4D values [16];
  
  uVar47 = in->depth;
  local_1de0 = __return_storage_ptr__;
  if ((this->cfg).maxDepth < uVar47) {
    puVar35 = (undefined8 *)__cxa_allocate_exception(0x30);
    v0.field_0.v[0] = (longlong)&local_17b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&v0,"depth limit reached","");
    *puVar35 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar35 + 1) = 1;
    puVar35[2] = puVar35 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar35 + 2),v0.field_0.v[0],v0.field_0.v[1] + v0.field_0.v[0]);
    __cxa_throw(puVar35,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  aVar22 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
            (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
            bounds0.lower.field_0.m128;
  uVar72 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.upper.field_0;
  uVar17 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.upper.field_0 + 8);
  local_1e48 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.lower.field_0.m128;
  _local_1e38 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                 (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds1.upper.field_0.m128;
  local_1e08 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                centBounds.lower.field_0.m128;
  aVar23 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
            (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
            upper.field_0.m128;
  pBVar45 = (__pointer_type)(in->prims).super_PrimInfoMB.object_range._begin;
  _Var7._M_p = (__pointer_type)(in->prims).super_PrimInfoMB.object_range._end;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  BVar39 = (BBox1f)(in->prims).prims;
  uVar51 = &v0;
  findFallback((Split *)uVar51,this,&in->prims);
  local_16e8[0] = local_1798;
  _local_1718 = v0.field_0;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.lower.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)local_1e48;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.upper.field_0 = _local_1e38;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0 = local_1e08;
  current.super_BuildRecord.prims.super_PrimInfoMB.num_time_segments = values[0].ref.ptr;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_num_time_segments = values[0]._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar28 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  current.split.sah = (float)v0.field_0._0_4_;
  current.split.dim = v0.field_0._4_4_;
  current.split.field_2.pos = local_1718._8_4_;
  current.split.data = local_1718._12_4_;
  current.split.mapping.num = local_17b8._0_8_;
  current.split.mapping.ofs.field_0._0_8_ = local_17a8._0_8_;
  current.split.mapping.ofs.field_0._8_8_ = local_17a8._8_8_;
  current.split.mapping.scale.field_0 = local_1798;
  uVar58 = (long)_Var7._M_p - (long)pBVar45;
  if (uVar58 == 0 || uVar47 != 1) {
    bVar48 = 0;
  }
  else {
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
         (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
         (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar38 = (long)_Var7._M_p - (long)pBVar45;
    if (_Var7._M_p < pBVar45 || lVar38 == 0) {
      auVar64 = ZEXT816(0xff8000007f800000);
    }
    else {
      pBVar37 = &(*(PrimRefMB **)((long)BVar39 + 0x20))[(long)pBVar45].time_range;
      auVar64 = ZEXT816(0xff8000007f800000);
      do {
        auVar79._8_8_ = 0;
        auVar79._0_4_ = pBVar37->lower;
        auVar79._4_4_ = pBVar37->upper;
        auVar66 = vcmpps_avx(auVar64,auVar79,1);
        auVar65 = vinsertps_avx(auVar64,auVar79,0x50);
        auVar64 = vblendps_avx(auVar79,auVar64,2);
        auVar64 = vblendvps_avx(auVar64,auVar65,auVar66);
        pBVar37 = pBVar37 + 10;
        lVar38 = lVar38 + -1;
      } while (lVar38 != 0);
    }
    auVar66 = vmovshdup_avx(auVar64);
    auVar66 = vcmpps_avx(auVar66,ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.
                                               time_range.upper),1);
    auVar64 = vcmpps_avx(ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.time_range.
                                       lower),auVar64,1);
    auVar64 = vorps_avx(auVar64,auVar66);
    bVar48 = auVar64[0] & 1;
  }
  local_1e20 = in;
  current.super_BuildRecord.depth = uVar47;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.lower.field_0 = aVar22;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.upper.field_0._0_8_ = uVar72;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.upper.field_0._8_8_ = uVar17;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0 = aVar23;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin = (unsigned_long)pBVar45;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end = (unsigned_long)_Var7._M_p;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range = BVar28;
  current.super_BuildRecord.prims.prims = (PrimRefVector)BVar39;
  if (((uVar58 <= (this->cfg).maxLeafSize) && (current.split.data < 2)) && (bVar48 == 0)) {
    uVar47 = uVar58 + 3 >> 2;
    geomID.field_0.v[0] = uVar47 * 0x50;
    this_00.ptr = (size_t)(alloc.talloc1)->parent;
    if (alloc.alloc != (((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = this_00.ptr;
      MutexSys::lock((MutexSys *)this_00.ptr);
      if ((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p != (__pointer_type)0x0
         ) {
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)(this_00.ptr + 0xa8) + (long)*(void **)(this_00.ptr + 0x68);
        UNLOCK();
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((long)*(void **)(this_00.ptr + 0x58) + (long)*(void **)(this_00.ptr + 0x98)) -
             ((long)*(void **)(this_00.ptr + 0x50) + (long)*(void **)(this_00.ptr + 0x90)));
        UNLOCK();
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesWasted
        ;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)(this_00.ptr + 0xb0) + (long)*(void **)(this_00.ptr + 0x70);
        UNLOCK();
      }
      auVar64 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])(this_00.ptr + 0x58) = ZEXT1632(auVar64);
      *(undefined1 (*) [32])(this_00.ptr + 0x48) = ZEXT1632(auVar64);
      auVar71 = ZEXT1632(auVar64);
      if (alloc.alloc == (FastAllocator *)0x0) {
        *(undefined1 (*) [32])(this_00.ptr + 0x98) = auVar71;
        *(undefined1 (*) [32])(this_00.ptr + 0x88) = auVar71;
      }
      else {
        *(void **)(this_00.ptr + 0x60) = (void *)(alloc.alloc)->defaultBlockSize;
        *(undefined1 (*) [32])(this_00.ptr + 0x88) = auVar71;
        *(undefined1 (*) [32])(this_00.ptr + 0x98) = auVar71;
        *(void **)(this_00.ptr + 0xa0) = (void *)(alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p = alloc.alloc;
      UNLOCK();
      v2.field_0.v[0] = this_00.ptr;
      v0.field_0.v[1]._0_1_ = 1;
      v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar10._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar10,(ThreadLocal2 **)&v2);
      }
      else {
        *iVar10._M_current = (ThreadLocal2 *)v2.field_0.v[0];
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      _local_1718 = v0.field_0;
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
        _local_1718 = v0.field_0;
      }
    }
    v0.field_0 = _local_1718;
    uVar51 = geomID.field_0.v[0];
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + geomID.field_0.v[0];
    sVar34 = (alloc.talloc1)->cur;
    uVar41 = (ulong)(-(int)sVar34 & 0x1f);
    uVar33 = sVar34 + geomID.field_0.v[0] + uVar41;
    (alloc.talloc1)->cur = uVar33;
    if ((alloc.talloc1)->end < uVar33) {
      (alloc.talloc1)->cur = sVar34;
      uVar33 = (alloc.talloc1)->allocBlockSize;
      if ((ulong)(geomID.field_0.v[0] * 4) < uVar33 || geomID.field_0.v[0] * 4 - uVar33 == 0) {
        v0.field_0.v[0] = uVar33;
        pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc1)->ptr = pcVar46;
        sVar34 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar34;
        (alloc.talloc1)->end = v0.field_0.v[0];
        (alloc.talloc1)->cur = uVar51;
        if ((ulong)v0.field_0.v[0] < (ulong)uVar51) {
          (alloc.talloc1)->cur = 0;
          v0.field_0.v[0] = (alloc.talloc1)->allocBlockSize;
          pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
          (alloc.talloc1)->ptr = pcVar46;
          sVar34 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar34;
          (alloc.talloc1)->end = v0.field_0.v[0];
          (alloc.talloc1)->cur = uVar51;
          if ((ulong)v0.field_0.v[0] < (ulong)uVar51) {
            (alloc.talloc1)->cur = 0;
            pcVar46 = (char *)0x0;
            goto LAB_0131a74a;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar34;
      }
      else {
        pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&geomID);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar41;
      pcVar46 = (alloc.talloc1)->ptr + (uVar33 - geomID.field_0._0_8_);
    }
LAB_0131a74a:
    uVar33 = 7;
    if (uVar47 < 7) {
      uVar33 = uVar47;
    }
    if (uVar58 + 3 < 4) {
      auVar68._8_4_ = 0x7f800000;
      auVar68._0_8_ = 0x7f8000007f800000;
      auVar68._12_4_ = 0x7f800000;
      local_1dc8._8_4_ = 0xff800000;
      local_1dc8._0_8_ = 0xff800000ff800000;
      local_1dc8._12_4_ = 0xff800000;
      local_1df8._8_4_ = 0xff800000;
      local_1df8._0_8_ = 0xff800000ff800000;
      local_1df8._12_4_ = 0xff800000;
      local_1e18 = auVar68;
    }
    else {
      auVar68._8_4_ = 0x7f800000;
      auVar68._0_8_ = 0x7f8000007f800000;
      auVar68._12_4_ = 0x7f800000;
      local_1e20 = (BuildRecord *)0x0;
      auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
      local_1df8._8_4_ = 0xff800000;
      local_1df8._0_8_ = 0xff800000ff800000;
      local_1df8._12_4_ = 0xff800000;
      local_1dc8._8_4_ = 0xff800000;
      local_1dc8._0_8_ = 0xff800000ff800000;
      local_1dc8._12_4_ = 0xff800000;
      local_1e18 = auVar68;
      do {
        pPVar12 = (current.super_BuildRecord.prims.prims)->items;
        pSVar13 = ((this->createLeaf).bvh)->scene;
        auVar69._8_8_ = 0;
        auVar69._0_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
        auVar69._4_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
        v2.field_0 = auVar128._0_16_;
        auVar70._8_8_ = 0;
        auVar70._0_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
        auVar70._4_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)vpcmpeqd_avx(auVar69,auVar70);
        pPVar54 = pPVar12 + (long)pBVar45;
        lVar38 = 0;
        geomID.field_0 =
             (anon_union_16_2_9473010e_for_vuint_impl<4>_1)
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0;
        v0.field_0 = v2.field_0;
        values[0]._0_16_ = (undefined1  [16])v2.field_0;
        do {
          if (pBVar45 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end) {
            fVar73 = (pPVar54->lbounds).bounds0.lower.field_0.m128[3];
            *(float *)((long)&geomID.field_0 + lVar38) = fVar73;
            fVar107 = (pPVar54->lbounds).bounds0.upper.field_0.m128[3];
            *(float *)((long)&left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                              .lower.field_0 + lVar38) = fVar107;
            pGVar14 = (pSVar13->geometries).items[(uint)fVar73].ptr;
            lVar30 = *(long *)&pGVar14->field_0x58;
            lVar31 = (ulong)(uint)fVar107 *
                     pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
            uVar50 = *(uint *)&pGVar14[1].intersectionFilterN >> 2;
            *(uint *)((long)&v0.field_0 + lVar38) = *(int *)(lVar30 + lVar31) * uVar50;
            *(uint *)((long)&values[0].ref.ptr + lVar38) = *(int *)(lVar30 + 4 + lVar31) * uVar50;
            *(uint *)((long)&v2.field_0 + lVar38) = uVar50 * *(int *)(lVar30 + 8 + lVar31);
            pBVar45 = (__pointer_type)
                      ((long)&(pBVar45->cur).super___atomic_base<unsigned_long>._M_i + 1);
          }
          else if (lVar38 != 0) {
            *(uint *)((long)&geomID.field_0 + lVar38) = geomID.field_0.i[0];
            *(undefined4 *)
             ((long)&left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0 + lVar38) = 0xffffffff;
            uVar6 = v0.field_0.i[0];
            *(uint *)((long)&v0.field_0 + lVar38) = v0.field_0.i[0];
            *(undefined4 *)((long)&values[0].ref.ptr + lVar38) = uVar6;
            *(undefined4 *)((long)&v2.field_0 + lVar38) = uVar6;
          }
          if (pBVar45 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end) {
            pPVar54 = pPVar12 + (long)pBVar45;
          }
          lVar38 = lVar38 + 4;
        } while (lVar38 != 0x10);
        lVar38 = (long)local_1e20 * 0x50;
        *(longlong *)(pcVar46 + lVar38) = v0.field_0.v[0];
        *(longlong *)((long)(pcVar46 + lVar38) + 8) = v0.field_0.v[1];
        *(size_t *)(pcVar46 + lVar38 + 0x10) = values[0].ref.ptr;
        *(undefined8 *)((long)(pcVar46 + lVar38 + 0x10) + 8) = values[0]._8_8_;
        *(longlong *)(pcVar46 + lVar38 + 0x20) = v2.field_0.v[0];
        *(longlong *)((long)(pcVar46 + lVar38 + 0x20) + 8) = v2.field_0.v[1];
        *(longlong *)(pcVar46 + lVar38 + 0x30) = geomID.field_0.v[0];
        *(longlong *)((long)(pcVar46 + lVar38 + 0x30) + 8) = geomID.field_0.v[1];
        *(undefined8 *)(pcVar46 + lVar38 + 0x40) =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        *(undefined8 *)(pcVar46 + lVar38 + 0x40 + 8) =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        auVar65 = vmovshdup_avx(auVar69);
        lVar30 = 0;
        auVar78._8_4_ = 0xff800000;
        auVar78._0_8_ = 0xff800000ff800000;
        auVar78._12_4_ = 0xff800000;
        auVar130._8_4_ = 0x7f800000;
        auVar130._0_8_ = 0x7f8000007f800000;
        auVar130._12_4_ = 0x7f800000;
        auVar66 = auVar130;
        auVar64 = auVar78;
        do {
          if ((ulong)*(uint *)(pcVar46 + lVar30 * 4 + lVar38 + 0x40) == 0xffffffff) break;
          pGVar14 = (pSVar13->geometries).items[*(uint *)(pcVar46 + lVar30 * 4 + lVar38 + 0x30)].ptr
          ;
          fVar73 = pGVar14->fnumTimeSegments;
          fVar107 = (pGVar14->time_range).lower;
          local_1e08._0_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
          fVar113 = (pGVar14->time_range).upper - fVar107;
          fVar62 = ((float)local_1e08._0_4_ - fVar107) / fVar113;
          local_1c28 = auVar65._0_4_;
          fVar113 = ((float)local_1c28 - fVar107) / fVar113;
          fVar107 = fVar73 * fVar62;
          fVar101 = fVar73 * fVar113;
          auVar82 = vroundss_avx(ZEXT416((uint)fVar107),ZEXT416((uint)fVar107),9);
          auVar67 = vroundss_avx(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101),10);
          auVar77 = auVar127._0_16_;
          auVar79 = vmaxss_avx(auVar82,auVar77);
          auVar76 = vminss_avx(auVar67,ZEXT416((uint)fVar73));
          fVar93 = auVar76._0_4_;
          iVar5 = (int)auVar82._0_4_;
          if ((int)auVar82._0_4_ < 0) {
            iVar5 = -1;
          }
          uVar50 = (int)fVar73 + 1U;
          if ((int)auVar67._0_4_ < (int)((int)fVar73 + 1U)) {
            uVar50 = (int)auVar67._0_4_;
          }
          lVar49 = (ulong)*(uint *)(pcVar46 + lVar30 * 4 + lVar38 + 0x40) *
                   pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar31 = *(long *)&pGVar14->field_0x58;
          uVar60 = (ulong)*(uint *)(lVar31 + lVar49);
          uVar41 = (ulong)*(uint *)(lVar31 + 4 + lVar49);
          lVar15 = *(long *)&pGVar14[2].numPrimitives;
          lVar59 = (long)(int)auVar79._0_4_ * 0x38;
          lVar16 = *(long *)(lVar15 + lVar59);
          lVar52 = *(long *)(lVar15 + 0x10 + lVar59);
          auVar76 = *(undefined1 (*) [16])(lVar16 + lVar52 * uVar60);
          auVar82 = *(undefined1 (*) [16])(lVar16 + lVar52 * uVar41);
          uVar58 = (ulong)*(uint *)(lVar31 + 8 + lVar49);
          auVar67 = *(undefined1 (*) [16])(lVar16 + lVar52 * uVar58);
          lVar52 = (long)(int)fVar93 * 0x38;
          lVar31 = *(long *)(lVar15 + lVar52);
          lVar16 = *(long *)(lVar15 + 0x10 + lVar52);
          auVar83 = *(undefined1 (*) [16])(lVar31 + lVar16 * uVar60);
          auVar63 = *(undefined1 (*) [16])(lVar31 + lVar16 * uVar41);
          auVar74 = *(undefined1 (*) [16])(lVar31 + lVar16 * uVar58);
          auVar75 = vminps_avx(auVar76,auVar82);
          auVar76 = vmaxps_avx(auVar76,auVar82);
          auVar75 = vminps_avx(auVar75,auVar67);
          auVar76 = vmaxps_avx(auVar76,auVar67);
          auVar82 = vminps_avx(auVar83,auVar63);
          auVar67 = vminps_avx(auVar82,auVar74);
          auVar82 = vmaxps_avx(auVar83,auVar63);
          auVar82 = vmaxps_avx(auVar82,auVar74);
          auVar79 = ZEXT416((uint)(fVar107 - auVar79._0_4_));
          fVar90 = auVar75._0_4_;
          fVar131 = auVar76._0_4_;
          fVar132 = auVar76._4_4_;
          fVar133 = auVar76._8_4_;
          fVar134 = auVar76._12_4_;
          fVar107 = auVar67._0_4_;
          fVar110 = auVar67._4_4_;
          fVar111 = auVar67._8_4_;
          fVar112 = auVar67._12_4_;
          fVar98 = auVar82._0_4_;
          fVar99 = auVar82._4_4_;
          fVar122 = auVar82._8_4_;
          fVar123 = auVar82._12_4_;
          fVar91 = auVar75._4_4_;
          fVar92 = auVar75._8_4_;
          fVar97 = auVar75._12_4_;
          if (uVar50 - iVar5 == 1) {
            auVar79 = vmaxss_avx(auVar79,auVar77);
            auVar76 = vshufps_avx(auVar79,auVar79,0);
            auVar79 = ZEXT416((uint)(1.0 - auVar79._0_4_));
            auVar79 = vshufps_avx(auVar79,auVar79,0);
            auVar80._0_4_ = fVar90 * auVar79._0_4_ + fVar107 * auVar76._0_4_;
            auVar80._4_4_ = fVar91 * auVar79._4_4_ + fVar110 * auVar76._4_4_;
            auVar80._8_4_ = fVar92 * auVar79._8_4_ + fVar111 * auVar76._8_4_;
            auVar80._12_4_ = fVar97 * auVar79._12_4_ + fVar112 * auVar76._12_4_;
            auVar100._0_4_ = fVar131 * auVar79._0_4_ + fVar98 * auVar76._0_4_;
            auVar100._4_4_ = fVar132 * auVar79._4_4_ + fVar99 * auVar76._4_4_;
            auVar100._8_4_ = fVar133 * auVar79._8_4_ + fVar122 * auVar76._8_4_;
            auVar100._12_4_ = fVar134 * auVar79._12_4_ + fVar123 * auVar76._12_4_;
            auVar79 = vmaxss_avx(ZEXT416((uint)(fVar93 - fVar101)),auVar77);
            auVar76 = vshufps_avx(auVar79,auVar79,0);
            auVar79 = ZEXT416((uint)(1.0 - auVar79._0_4_));
            auVar79 = vshufps_avx(auVar79,auVar79,0);
            auVar88._0_4_ = fVar90 * auVar76._0_4_ + fVar107 * auVar79._0_4_;
            auVar88._4_4_ = fVar91 * auVar76._4_4_ + fVar110 * auVar79._4_4_;
            auVar88._8_4_ = fVar92 * auVar76._8_4_ + fVar111 * auVar79._8_4_;
            auVar88._12_4_ = fVar97 * auVar76._12_4_ + fVar112 * auVar79._12_4_;
            auVar95._0_4_ = fVar131 * auVar76._0_4_ + fVar98 * auVar79._0_4_;
            auVar95._4_4_ = fVar132 * auVar76._4_4_ + fVar99 * auVar79._4_4_;
            auVar95._8_4_ = fVar133 * auVar76._8_4_ + fVar122 * auVar79._8_4_;
            auVar95._12_4_ = fVar134 * auVar76._12_4_ + fVar123 * auVar79._12_4_;
          }
          else {
            lVar31 = *(long *)(lVar59 + lVar15 + 0x38);
            lVar16 = *(long *)(lVar59 + lVar15 + 0x48);
            auVar76 = *(undefined1 (*) [16])(lVar31 + lVar16 * uVar60);
            auVar82 = *(undefined1 (*) [16])(lVar31 + lVar16 * uVar41);
            auVar67 = *(undefined1 (*) [16])(lVar31 + lVar16 * uVar58);
            auVar77 = vminps_avx(auVar76,auVar82);
            auVar83 = vminps_avx(auVar77,auVar67);
            auVar76 = vmaxps_avx(auVar76,auVar82);
            auVar77 = vmaxps_avx(auVar76,auVar67);
            lVar31 = *(long *)(lVar52 + lVar15 + -0x38);
            lVar16 = *(long *)(lVar52 + lVar15 + -0x28);
            auVar76 = *(undefined1 (*) [16])(lVar31 + lVar16 * uVar60);
            auVar82 = *(undefined1 (*) [16])(lVar31 + lVar16 * uVar41);
            auVar67 = *(undefined1 (*) [16])(lVar31 + lVar16 * uVar58);
            auVar63 = vminps_avx(auVar76,auVar82);
            auVar63 = vminps_avx(auVar63,auVar67);
            auVar76 = vmaxps_avx(auVar76,auVar82);
            auVar76 = vmaxps_avx(auVar76,auVar67);
            auVar79 = vmaxss_avx(auVar79,ZEXT816(0) << 0x40);
            auVar82 = vshufps_avx(auVar79,auVar79,0);
            auVar79 = ZEXT416((uint)(1.0 - auVar79._0_4_));
            auVar79 = vshufps_avx(auVar79,auVar79,0);
            auVar80._0_4_ = fVar90 * auVar79._0_4_ + auVar82._0_4_ * auVar83._0_4_;
            auVar80._4_4_ = fVar91 * auVar79._4_4_ + auVar82._4_4_ * auVar83._4_4_;
            auVar80._8_4_ = fVar92 * auVar79._8_4_ + auVar82._8_4_ * auVar83._8_4_;
            auVar80._12_4_ = fVar97 * auVar79._12_4_ + auVar82._12_4_ * auVar83._12_4_;
            auVar100._0_4_ = fVar131 * auVar79._0_4_ + auVar82._0_4_ * auVar77._0_4_;
            auVar100._4_4_ = fVar132 * auVar79._4_4_ + auVar82._4_4_ * auVar77._4_4_;
            auVar100._8_4_ = fVar133 * auVar79._8_4_ + auVar82._8_4_ * auVar77._8_4_;
            auVar100._12_4_ = fVar134 * auVar79._12_4_ + auVar82._12_4_ * auVar77._12_4_;
            auVar79 = vmaxss_avx(ZEXT416((uint)(fVar93 - fVar101)),ZEXT416(0));
            auVar82 = vshufps_avx(auVar79,auVar79,0);
            auVar79 = ZEXT416((uint)(1.0 - auVar79._0_4_));
            auVar79 = vshufps_avx(auVar79,auVar79,0);
            auVar88._0_4_ = auVar79._0_4_ * fVar107 + auVar63._0_4_ * auVar82._0_4_;
            auVar88._4_4_ = auVar79._4_4_ * fVar110 + auVar63._4_4_ * auVar82._4_4_;
            auVar88._8_4_ = auVar79._8_4_ * fVar111 + auVar63._8_4_ * auVar82._8_4_;
            auVar88._12_4_ = auVar79._12_4_ * fVar112 + auVar63._12_4_ * auVar82._12_4_;
            auVar95._0_4_ = auVar79._0_4_ * fVar98 + auVar82._0_4_ * auVar76._0_4_;
            auVar95._4_4_ = auVar79._4_4_ * fVar99 + auVar82._4_4_ * auVar76._4_4_;
            auVar95._8_4_ = auVar79._8_4_ * fVar122 + auVar82._8_4_ * auVar76._8_4_;
            auVar95._12_4_ = auVar79._12_4_ * fVar123 + auVar82._12_4_ * auVar76._12_4_;
            uVar55 = iVar5 + 1;
            if ((int)uVar55 < (int)uVar50) {
              plVar42 = (long *)(lVar15 + (ulong)uVar55 * 0x38 + 0x10);
              auVar128 = ZEXT864(0) << 0x20;
              do {
                auVar104._0_4_ = ((float)(int)uVar55 / fVar73 - fVar62) / (fVar113 - fVar62);
                auVar104._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar79 = vshufps_avx(auVar104,auVar104,0);
                fVar90 = auVar88._4_4_;
                fVar91 = auVar88._8_4_;
                fVar92 = auVar88._12_4_;
                auVar76 = vshufps_avx(ZEXT416((uint)(1.0 - auVar104._0_4_)),
                                      ZEXT416((uint)(1.0 - auVar104._0_4_)),0);
                fVar107 = auVar80._4_4_;
                fVar93 = auVar80._8_4_;
                fVar111 = auVar80._12_4_;
                auVar115._0_4_ = auVar88._0_4_ * auVar79._0_4_ + auVar76._0_4_ * auVar80._0_4_;
                auVar115._4_4_ = fVar90 * auVar79._4_4_ + auVar76._4_4_ * fVar107;
                auVar115._8_4_ = fVar91 * auVar79._8_4_ + auVar76._8_4_ * fVar93;
                auVar115._12_4_ = fVar92 * auVar79._12_4_ + auVar76._12_4_ * fVar111;
                fVar97 = auVar95._4_4_;
                fVar98 = auVar95._8_4_;
                fVar99 = auVar95._12_4_;
                fVar101 = auVar100._4_4_;
                fVar110 = auVar100._8_4_;
                fVar112 = auVar100._12_4_;
                auVar105._0_4_ = auVar76._0_4_ * auVar100._0_4_ + auVar95._0_4_ * auVar79._0_4_;
                auVar105._4_4_ = auVar76._4_4_ * fVar101 + fVar97 * auVar79._4_4_;
                auVar105._8_4_ = auVar76._8_4_ * fVar110 + fVar98 * auVar79._8_4_;
                auVar105._12_4_ = auVar76._12_4_ * fVar112 + fVar99 * auVar79._12_4_;
                lVar31 = plVar42[-2];
                lVar15 = *plVar42;
                auVar79 = *(undefined1 (*) [16])(lVar31 + lVar15 * uVar60);
                auVar76 = *(undefined1 (*) [16])(lVar31 + lVar15 * uVar41);
                auVar82 = *(undefined1 (*) [16])(lVar31 + lVar15 * uVar58);
                auVar67 = vminps_avx(auVar79,auVar76);
                auVar67 = vminps_avx(auVar67,auVar82);
                auVar67 = vsubps_avx(auVar67,auVar115);
                auVar79 = vmaxps_avx(auVar79,auVar76);
                auVar79 = vmaxps_avx(auVar79,auVar82);
                auVar79 = vsubps_avx(auVar79,auVar105);
                auVar76 = vminps_avx(auVar67,ZEXT816(0) << 0x20);
                auVar79 = vmaxps_avx(auVar79,ZEXT816(0) << 0x20);
                auVar80._0_4_ = auVar76._0_4_ + auVar80._0_4_;
                auVar80._4_4_ = auVar76._4_4_ + fVar107;
                auVar80._8_4_ = auVar76._8_4_ + fVar93;
                auVar80._12_4_ = auVar76._12_4_ + fVar111;
                auVar88._0_4_ = auVar76._0_4_ + auVar88._0_4_;
                auVar88._4_4_ = auVar76._4_4_ + fVar90;
                auVar88._8_4_ = auVar76._8_4_ + fVar91;
                auVar88._12_4_ = auVar76._12_4_ + fVar92;
                auVar100._0_4_ = auVar100._0_4_ + auVar79._0_4_;
                auVar100._4_4_ = fVar101 + auVar79._4_4_;
                auVar100._8_4_ = fVar110 + auVar79._8_4_;
                auVar100._12_4_ = fVar112 + auVar79._12_4_;
                auVar95._0_4_ = auVar95._0_4_ + auVar79._0_4_;
                auVar95._4_4_ = fVar97 + auVar79._4_4_;
                auVar95._8_4_ = fVar98 + auVar79._8_4_;
                auVar95._12_4_ = fVar99 + auVar79._12_4_;
                uVar55 = uVar55 + 1;
                plVar42 = plVar42 + 7;
              } while (uVar50 != uVar55);
            }
            else {
              auVar128 = ZEXT864(0) << 0x40;
            }
          }
          auVar66 = vminps_avx(auVar66,auVar80);
          auVar78 = vmaxps_avx(auVar78,auVar100);
          auVar130 = vminps_avx(auVar130,auVar88);
          auVar64 = vmaxps_avx(auVar64,auVar95);
          lVar30 = lVar30 + 1;
          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
        } while (lVar30 != 4);
        local_1df8 = vmaxps_avx(local_1df8,auVar64);
        local_1e18 = vminps_avx(local_1e18,auVar130);
        local_1dc8 = vmaxps_avx(local_1dc8,auVar78);
        auVar68 = vminps_avx(auVar68,auVar66);
        local_1e20 = (BuildRecord *)((long)local_1e20 + 1);
      } while (local_1e20 != (BuildRecord *)(uVar47 + (uVar47 == 0)));
    }
    (local_1de0->ref).ptr = uVar33 | (ulong)pcVar46 | 8;
    *(undefined1 (*) [16])(local_1de0->lbounds).bounds0.lower.field_0.m128 = auVar68;
    *(undefined8 *)&(local_1de0->lbounds).bounds0.upper.field_0 = local_1dc8._0_8_;
    *(undefined8 *)((long)&(local_1de0->lbounds).bounds0.upper.field_0 + 8) = local_1dc8._8_8_;
    *(undefined8 *)&(local_1de0->lbounds).bounds1.lower.field_0 = local_1e18._0_8_;
    *(undefined8 *)((long)&(local_1de0->lbounds).bounds1.lower.field_0 + 8) = local_1e18._8_8_;
    *(undefined8 *)&(local_1de0->lbounds).bounds1.upper.field_0 = local_1df8._0_8_;
    *(undefined8 *)((long)&(local_1de0->lbounds).bounds1.upper.field_0 + 8) = local_1df8._8_8_;
    local_1de0->dt = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
    return local_1de0;
  }
  lVar38 = 0xbc;
  do {
    *(undefined8 *)((long)&current.split.mapping.scale.field_0 + lVar38 + 4) = 0xffffffff7f800000;
    *(undefined8 *)((long)&current.split.mapping.scale.field_0 + lVar38 + 0xc) = 0;
    lVar38 = lVar38 + 0xf0;
  } while (lVar38 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  v0.field_0.v[0] = uVar47;
  local_1798 = local_1e48;
  local_1788 = _local_1e38;
  local_1778 = local_1e08;
  local_1758 = pBVar45;
  aStack_1750._M_b._M_p = (__base_type)(__base_type)_Var7._M_p;
  sStack_1748 = values[0].ref.ptr;
  sStack_1740 = values[0]._8_8_;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  uStack_172c = values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar39;
  local_1708 = (int)local_17b8.m128[0];
  aiStack_1704[0] = (int)local_17b8.m128[1];
  local_16f8 = local_17a8._0_8_;
  uStack_16f0 = local_17a8._8_8_;
  local_840 = BVar39;
  local_838[0] = 2;
  local_8c8[0] = &local_840;
  local_1e38 = (undefined1  [8])&local_1b68;
  local_1e08._0_8_ = &local_1a78;
  pHVar4 = &this->heuristicTemporalSplit;
  local_1db8.i[2] = 0x7f800000;
  local_1db8._0_8_ = 0x7f8000007f800000;
  local_1db8.i[3] = 0x7f800000;
  local_1da8.i[2] = 0xff800000;
  local_1da8._0_8_ = 0xff800000ff800000;
  local_1da8.i[3] = 0xff800000;
  bVar53 = 0;
  local_17b8 = aVar22;
  local_17a8._0_8_ = uVar72;
  local_17a8._8_8_ = uVar17;
  local_1768 = aVar23;
  do {
    if (local_848 == 0) goto LAB_01319cc8;
    lVar38 = -1;
    ppBVar44 = &local_1758;
    uVar47 = 0;
    uVar51 = 0;
    do {
      uVar58 = (long)ppBVar44[1] - (long)*ppBVar44;
      if ((((this->cfg).maxLeafSize < uVar58) || (1 < *(uint *)((long)ppBVar44 + 0x4c))) ||
         (bVar48 != 0)) {
        if (uVar47 < uVar58) {
          lVar38 = uVar51;
          uVar47 = uVar58;
        }
        bVar48 = 0;
      }
      uVar51 = uVar51 + 1;
      ppBVar44 = ppBVar44 + 0x1e;
    } while (local_848 != uVar51);
    if (lVar38 == -1) goto LAB_01319c81;
    lVar30 = lVar38 * 0xf0;
    v2.field_0.v[0] = current.super_BuildRecord.depth + 1;
    local_1b68 = (PrimRef *)0xffffffff7f800000;
    uStack_1b60 = 0;
    geomID.field_0.v[0] = current.super_BuildRecord.depth + 1;
    local_1a78 = 0xffffffff7f800000;
    uStack_1a70 = 0;
    pSVar3 = (Split *)(local_1718 + lVar30);
    iVar5 = aiStack_1704[(lVar38 * 0x1e + -1) * 2];
    local_1e48._0_8_ = &(&v0)[lVar38 * 0xf].field_0;
    if (iVar5 == 0) {
      pBVar45 = (&local_1758)[lVar38 * 0x1e];
      pBVar56 = (&aStack_1750)[lVar38 * 0x1e]._M_b._M_p;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      left.max_time_range.lower = 0.0;
      left.object_range._begin = 0;
      left.object_range._end = 0;
      left.num_time_segments = 0;
      left.max_num_time_segments = 0;
      auVar86._8_4_ = 0x3f800000;
      auVar86._0_8_ = 0x3f8000003f800000;
      auVar86._12_4_ = 0x3f800000;
      uVar51 = vmovlps_avx(auVar86);
      left.max_time_range.upper = (float)uVar51;
      left.time_range.lower = (float)((ulong)uVar51 >> 0x20);
      left.time_range.upper = 0.0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      right.max_time_range.lower = 0.0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      uVar51 = vmovlps_avx(auVar86);
      right.max_time_range.upper = (float)uVar51;
      right.time_range.lower = (float)((ulong)uVar51 >> 0x20);
      right.time_range.upper = 0.0;
      vSplitPos.field_0.i[1] = *(undefined4 *)(local_1718 + lVar30 + 8);
      vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
      lVar31 = (long)(1 << (local_1718[lVar30 + 4] & 0x1f)) * 0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar31);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar31 + 8);
      isLeft.vSplitPos = &vSplitPos;
      isLeft.vSplitMask = &vSplitMask;
      isLeft.split = pSVar3;
      pBStack_1ba0 = (__pointer_type)
                     parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                               (*(PrimRefMB **)((long)local_1728[lVar38 * 0x1e] + 0x20),
                                (size_t)pBVar45,(size_t)pBVar56,(EmptyTy *)local_19d8,&left,&right,
                                &isLeft,&reduction,&reduction2,0x80,0xc00);
      local_1b78 = local_1728[lVar38 * 0x1e];
      auVar63._8_8_ = 0;
      auVar63._0_4_ = local_1728[lVar38 * 0x1e + -1].lower;
      auVar63._4_4_ = local_1728[lVar38 * 0x1e + -1].upper;
      auStack_1bf8._0_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0.m128[1],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0.m128[0]);
      auStack_1bf8._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0.m128[3],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0.m128[2]);
      local_1be8._0_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0.m128[1],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0.m128[0]);
      local_1be8._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0.m128[3],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0.m128[2]);
      aStack_1bd8._0_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[1],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[0]);
      aStack_1bd8._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[3],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[2]);
      local_1bc8.m128[1] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1];
      local_1bc8.m128[0] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0];
      local_1bc8._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    m128[3],left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[2]);
      aStack_1bb8._0_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                    m128[1],left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                            field_0.m128[0]);
      aStack_1bb8._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                    m128[3],left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                            field_0.m128[2]);
      local_1c08._0_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      local_1c08._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = auStack_1b88._8_8_;
      auVar64 = vcmpps_avx(auVar74,auVar63,1);
      auVar66 = vinsertps_avx(auVar63,auVar74,0x50);
      auVar65 = vinsertps_avx(auVar74,auVar63,0x50);
      auVar64 = vblendvps_avx(auVar65,auVar66,auVar64);
      uVar51 = vmovlps_avx(auVar64);
      auStack_1b88._8_8_ = uVar51;
      local_1b18._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      local_1b18._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      uStack_1b00 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .upper.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .upper.field_0.m128[2]);
      uStack_1b08 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0._0_8_;
      local_1af8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                            lower.field_0.m128[1],
                            right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                            lower.field_0.m128[0]);
      uStack_1af0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .lower.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .lower.field_0.m128[2]);
      uStack_1ae8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[1],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[0]);
      uStack_1ae0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[2]);
      local_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[1],
                            right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[0]);
      uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[2]);
      uStack_1ac8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[1],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[0]);
      uStack_1ac0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[2]);
      auVar75._8_8_ = 0;
      auVar75._0_8_ = auStack_1a98._8_8_;
      auVar64 = vcmpps_avx(auVar75,auVar63,1);
      auVar66 = vinsertps_avx(auVar63,auVar75,0x50);
      auVar65 = vinsertps_avx(auVar75,auVar63,0x50);
      auVar64 = vblendvps_avx(auVar65,auVar66,auVar64);
      uVar51 = vmovlps_avx(auVar64);
      auStack_1a98._8_8_ = uVar51;
      pBVar135 = this;
      local_1ba8 = pBVar45;
      local_1ab8 = pBStack_1ba0;
      pBStack_1ab0 = pBVar56;
      local_1a88 = local_1b78;
LAB_01318fa5:
      local_1e50.lower = 0.0;
      local_1e50.upper = 0.0;
      bVar61 = false;
    }
    else {
      this_01 = &local_17b8 + lVar38 * 0xf;
      local_1e18._0_8_ = this_01;
      if (iVar5 != 2) {
        if (iVar5 == 1) {
          SetMB::deterministic_order((SetMB *)&this_01->field_1);
          splitFallback(this,(SetMB *)local_1e18._0_8_,(SetMB *)local_1c08,
                        (SetMB *)&local_1b18.field_1);
          pBVar135 = this;
        }
        else {
          pBVar135 = this;
          if (iVar5 == 3) {
            SetMB::deterministic_order((SetMB *)&this_01->field_1);
            splitByGeometry(this,(SetMB *)local_1e18._0_8_,(SetMB *)local_1c08,
                            (SetMB *)&local_1b18.field_1);
            pBVar135 = this;
          }
        }
        goto LAB_01318fa5;
      }
      time_range1.lower = *(float *)(local_1718 + lVar30 + 8);
      time_range0.lower = local_1728[lVar38 * 0x1e + -1].lower;
      time_range1.upper = local_1728[lVar38 * 0x1e + -1].upper;
      local_1df8._0_4_ = local_1728[lVar38 * 0x1e].lower;
      local_1df8._4_4_ = local_1728[lVar38 * 0x1e].upper;
      time_range0.upper = time_range1.lower;
      BVar39 = (BBox1f)operator_new(0x28);
      pMVar8 = pHVar4->device;
      pBVar45 = (&aStack_1750)[lVar38 * 0x1e]._M_b._M_p;
      *(MemoryMonitorInterface **)BVar39 = pMVar8;
      *(undefined1 *)((long)BVar39 + 8) = 0;
      *(long *)((long)BVar39 + 0x10) = 0;
      *(long *)((long)BVar39 + 0x18) = 0;
      *(long *)((long)BVar39 + 0x20) = 0;
      lVar31 = (long)pBVar45 - (long)(&local_1758)[lVar38 * 0x1e];
      pBVar56 = pBVar45;
      pBVar135 = this;
      if (lVar31 != 0) {
        local_1a38 = lVar31;
        uVar47 = lVar31 * 0x50;
        (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,uVar47,0);
        if (uVar47 < 0x1c00000) {
          pvVar32 = alignedMalloc(uVar47,0x10);
        }
        else {
          pvVar32 = os_malloc(uVar47,(bool *)((long)BVar39 + 8));
        }
        *(void **)((long)BVar39 + 0x20) = pvVar32;
        *(long *)((long)BVar39 + 0x10) = local_1a38;
        *(long *)((long)BVar39 + 0x18) = local_1a38;
        pBVar45 = *(__pointer_type *)(local_1e48._0_8_ + 0x70);
        pBVar56 = *(__pointer_type *)(local_1e48._0_8_ + 0x78);
        pBVar135 = this;
      }
      pvVar25 = isLeft.vSplitPos;
      vSplitMask.field_0._0_8_ = local_1df8._0_8_;
      vSplitMask.field_0._8_8_ = &time_range0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      right.max_time_range.lower = 0.0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      auVar64._8_4_ = 0x3f800000;
      auVar64._0_8_ = 0x3f8000003f800000;
      auVar64._12_4_ = 0x3f800000;
      uVar51 = vmovlps_avx(auVar64);
      right.max_time_range.upper = (float)uVar51;
      right.time_range.lower = (float)((ulong)uVar51 >> 0x20);
      right.time_range.upper = 0.0;
      local_1e50 = BVar39;
      if ((ulong)((long)pBVar56 - (long)pBVar45) < 0xc00) {
        isLeft.split = (Split *)pBVar45;
        isLeft.vSplitPos = (vint *)pBVar56;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  (&left,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
      }
      else {
        isLeft.vSplitPos._6_2_ = SUB82(pvVar25,6);
        isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
        tbb::detail::r1::initialize((task_group_context *)&isLeft);
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vSplitPos.field_0.v[0] = (longlong)pBVar56;
        vSplitPos.field_0.v[1] = (longlong)pBVar45;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&left,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&isLeft,(task_group_context *)pBVar135);
        cVar29 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
        if (cVar29 != '\0') {
          prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar36,"task cancelled");
          __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&isLeft);
      }
      lVar31 = *(long *)(local_1e48._0_8_ + 0x70);
      pcVar57 = *(code **)(local_1e48._0_8_ + 0x78);
      uVar47 = (long)pcVar57 - lVar31;
      if (left.object_range._end - left.object_range._begin != uVar47) {
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = &time_range0;
        left.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                       (*(PrimRefMB **)((long)BVar39 + 0x20),0,uVar47,0x400,
                        (anon_class_8_1_41ce32a5 *)&right);
        lVar31 = *(long *)(local_1e48._0_8_ + 0x70);
        pcVar57 = *(code **)(local_1e48._0_8_ + 0x78);
        uVar47 = (long)pcVar57 - lVar31;
      }
      uVar51 = vSplitPos.field_0.v[1];
      auVar65._4_4_ = time_range0.upper;
      auVar65._0_4_ = time_range0.lower;
      auVar65._8_8_ = 0;
      auStack_1bf8._0_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0.m128[1],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0.m128[0]);
      auStack_1bf8._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0.m128[3],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0.m128[2]);
      local_1be8._0_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0.m128[1],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0.m128[0]);
      local_1be8._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0.m128[3],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0.m128[2]);
      aStack_1bd8._0_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[1],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[0]);
      aStack_1bd8._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[3],
                    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0.m128[2]);
      local_1bc8.m128[1] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1];
      local_1bc8.m128[0] =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0];
      local_1bc8._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    m128[3],left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[2]);
      aStack_1bb8._0_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                    m128[1],left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                            field_0.m128[0]);
      aStack_1bb8._8_8_ =
           CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                    m128[3],left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                            field_0.m128[2]);
      local_1c08._0_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      local_1c08._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      local_1ba8 = (__pointer_type)left.object_range._begin;
      auVar76._4_4_ = left.max_time_range.upper;
      auVar76._0_4_ = left.max_time_range.lower;
      auVar76._8_8_ = 0;
      auVar82._4_4_ = left.time_range.upper;
      auVar82._0_4_ = left.time_range.lower;
      auVar82._8_8_ = 0;
      auVar64 = vcmpps_avx(auVar82,auVar65,1);
      auVar66 = vinsertps_avx(auVar65,auVar82,0x50);
      auVar65 = vinsertps_avx(auVar82,auVar65,0x50);
      auVar64 = vblendvps_avx(auVar65,auVar66,auVar64);
      auStack_1b88 = vmovlhps_avx(auVar76,auVar64);
      _reduction2 = local_1df8._0_8_;
      isLeft.split = (Split *)0x7f8000007f800000;
      isLeft.vSplitPos = (vint *)0x7f8000007f800000;
      isLeft.vSplitMask = (vbool *)0xff800000ff800000;
      auVar66._8_4_ = 0x3f800000;
      auVar66._0_8_ = 0x3f8000003f800000;
      auVar66._12_4_ = 0x3f800000;
      vmovlps_avx(auVar66);
      pBStack_1ba0 = (__pointer_type)left.object_range._end;
      local_1b78 = BVar39;
      if (uVar47 < 0xc00) {
        vSplitPos.field_0.v[0] = lVar31;
        vSplitPos.field_0.v[1] = (longlong)pcVar57;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  (&right,(anon_class_24_3_35f68c7c *)&reduction2,(range<unsigned_long> *)&vSplitPos
                  );
      }
      else {
        vSplitPos.field_0.v[1]._4_1_ = 1;
        vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar51,6);
        vSplitPos.field_0.v[1]._5_1_ = 4;
        tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
        local_19d8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_19d8._8_8_ = &reduction2;
        _reduction = pcVar57;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19d8,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos,(task_group_context *)pBVar135);
        cVar29 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
        if (cVar29 != '\0') {
          prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar36,"task cancelled");
          __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
      }
      lVar31 = right.object_range._end - right.object_range._begin;
      right.object_range._begin = *(unsigned_long *)(local_1e48._0_8_ + 0x70);
      right.object_range._end = lVar31 + right.object_range._begin;
      if (lVar31 != *(unsigned_long *)(local_1e48._0_8_ + 0x78) - right.object_range._begin) {
        isLeft.split = (Split *)&time_range1;
        right.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                       (*(PrimRefMB **)(local_1df8._0_8_ + 0x20),right.object_range._begin,
                        *(unsigned_long *)(local_1e48._0_8_ + 0x78),0x400,
                        (anon_class_8_1_41ce32a6 *)&isLeft);
      }
      auVar79 = local_1df8;
      auVar67._4_4_ = time_range1.upper;
      auVar67._0_4_ = time_range1.lower;
      auVar67._8_8_ = 0;
      local_1b18._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      local_1b18._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      uStack_1b08 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                    field_0._0_8_;
      uStack_1b00 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .upper.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .upper.field_0.m128[2]);
      local_1af8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                            lower.field_0.m128[1],
                            right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                            lower.field_0.m128[0]);
      uStack_1af0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .lower.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .lower.field_0.m128[2]);
      uStack_1ae8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[1],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[0]);
      uStack_1ae0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
                             .upper.field_0.m128[2]);
      local_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[1],
                            right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                            field_0.m128[0]);
      uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                             field_0.m128[2]);
      uStack_1ac8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[1],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[0]);
      uStack_1ac0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[3],
                             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                             field_0.m128[2]);
      auVar77._4_4_ = right.max_time_range.upper;
      auVar77._0_4_ = right.max_time_range.lower;
      auVar77._8_8_ = 0;
      auVar83._4_4_ = right.time_range.upper;
      auVar83._0_4_ = right.time_range.lower;
      auVar83._8_8_ = 0;
      auVar64 = vcmpps_avx(auVar83,auVar67,1);
      auVar66 = vinsertps_avx(auVar67,auVar83,0x50);
      auVar65 = vinsertps_avx(auVar83,auVar67,0x50);
      auVar64 = vblendvps_avx(auVar65,auVar66,auVar64);
      auStack_1a98 = vmovlhps_avx(auVar77,auVar64);
      local_1a88.lower = (float)local_1df8._0_4_;
      local_1a88.upper = (float)local_1df8._4_4_;
      bVar61 = local_1e50 != (BBox1f)0x0;
      local_1df8 = auVar79;
      local_1ab8 = (__pointer_type)right.object_range._begin;
      pBStack_1ab0 = (__pointer_type)right.object_range._end;
    }
    uVar51 = &left;
    this = pBVar135;
    findFallback((Split *)uVar51,pBVar135,(SetMB *)local_1c08);
    *(undefined8 *)local_1e38 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
    *(undefined8 *)((long)local_1e38 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_;
    local_1b58 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          upper.field_0.m128[1],
                          left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          upper.field_0.m128[0]);
    local_1b48 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                          lower.field_0.m128[1],
                          left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                          lower.field_0.m128[0]);
    lStack_1b40 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           lower.field_0.m128[3],
                           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           lower.field_0.m128[2]);
    lStack_1b38 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           upper.field_0.m128[1],
                           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           upper.field_0.m128[0]);
    lStack_1b30 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           upper.field_0.m128[3],
                           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           upper.field_0.m128[2]);
    findFallback((Split *)uVar51,pBVar135,(SetMB *)&local_1b18.field_1);
    lVar31 = local_640;
    *(undefined8 *)local_1e08._0_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
    *(undefined8 *)(local_1e08._0_8_ + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_;
    local_1a68 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          upper.field_0.m128[1],
                          left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          upper.field_0.m128[0]);
    local_1a58 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                          lower.field_0.m128[1],
                          left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                          lower.field_0.m128[0]);
    uStack_1a50 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           lower.field_0.m128[3],
                           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           lower.field_0.m128[2]);
    uStack_1a48 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           upper.field_0.m128[1],
                           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           upper.field_0.m128[0]);
    uStack_1a40 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           upper.field_0.m128[3],
                           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                           upper.field_0.m128[2]);
    local_1e50 = (BBox1f)0x0;
    pBVar37 = local_8c8[lVar38];
    if (local_1b78 == *pBVar37) {
      pBVar37[1] = (BBox1f)((long)pBVar37[1] + 1);
      BVar39 = local_1b78;
    }
    else {
      local_640 = local_640 + 1;
      uVar51 = &local_840;
      *(BBox1f *)
       ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
         *)(uVar51 + 0x78) + (lVar31 * 2 + -0xf) * 8) = local_1b78;
      local_838[lVar31 * 2] = 1;
      local_8c8[lVar38] =
           (BBox1f *)
           ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
             *)(uVar51 + 0x78) + (lVar31 * 2 + -0xf) * 8);
      BVar39 = *pBVar37;
    }
    lVar38 = local_640;
    if (local_1a88 == BVar39) {
      local_8c8[local_848] = pBVar37;
      BVar39 = pBVar37[1];
      pBVar37[1] = (BBox1f)((long)BVar39 + 1);
    }
    else {
      local_640 = local_640 + 1;
      uVar51 = &local_840;
      *(BBox1f *)
       ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
         *)(uVar51 + 0x78) + (lVar38 * 2 + -0xf) * 8) = local_1a88;
      local_838[lVar38 * 2] = 1;
      local_8c8[local_848] =
           (BBox1f *)
           ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
             *)(uVar51 + 0x78) + (lVar38 * 2 + -0xf) * 8);
      BVar39 = (BBox1f)((long)pBVar37[1] + -1);
    }
    pBVar37[1] = BVar39;
    if (BVar39 == (BBox1f)0x0) {
      uVar51 = *pBVar37;
      if ((BBox1f)uVar51 != (BBox1f)0x0) {
        lVar38 = *(long *)(uVar51 + 0x18);
        pvVar32 = *(void **)&((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                               *)(uVar51 + 0x20))->field_0x0;
        if (pvVar32 != (void *)0x0) {
          if ((ulong)(lVar38 * 0x50) < 0x1c00000) {
            alignedFree(pvVar32);
          }
          else {
            os_free(pvVar32,lVar38 * 0x50,
                    (bool)*(default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                            *)(uVar51 + 8));
          }
        }
        if (lVar38 != 0) {
          (**(code **)**(undefined8 **)uVar51)(*(undefined8 **)uVar51,lVar38 * -0x50,1);
        }
        *(undefined8 *)
         &((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)(uVar51 + 0x10))->field_0x0 = 0;
        *(undefined8 *)(uVar51 + 0x18) = 0;
        *(undefined8 *)
         &((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)(uVar51 + 0x20))->field_0x0 = 0;
      }
      operator_delete((void *)uVar51);
    }
    auVar66 = auStack_1a98;
    auVar64 = auStack_1b88;
    *(longlong *)local_1e48._0_8_ = v2.field_0.v[0];
    *(undefined8 *)(local_1e48._0_8_ + 0x10) = local_1c08._0_8_;
    *(undefined8 *)(local_1e48._0_8_ + 0x18) = local_1c08._8_8_;
    *(undefined8 *)(local_1e48._0_8_ + 0x20) = auStack_1bf8._0_8_;
    *(undefined8 *)(local_1e48._0_8_ + 0x28) = auStack_1bf8._8_8_;
    *(undefined8 *)(local_1e48._0_8_ + 0x30) = local_1be8._0_8_;
    *(undefined8 *)(local_1e48._0_8_ + 0x38) = local_1be8._8_8_;
    *(undefined8 *)(local_1e48._0_8_ + 0x40) = aStack_1bd8._0_8_;
    *(undefined8 *)(local_1e48._0_8_ + 0x48) = aStack_1bd8._8_8_;
    ((BBox1f *)(local_1e48._0_8_ + 0x50))->lower = (float)local_1bc8._0_4_;
    ((BBox1f *)(local_1e48._0_8_ + 0x50))->upper = local_1bc8.m128[1];
    *(undefined8 *)(local_1e48._0_8_ + 0x58) = local_1bc8._8_8_;
    *(undefined8 *)(local_1e48._0_8_ + 0x60) = aStack_1bb8._0_8_;
    *(undefined8 *)(local_1e48._0_8_ + 0x68) = aStack_1bb8._8_8_;
    *(__pointer_type *)(local_1e48._0_8_ + 0x70) = local_1ba8;
    *(__pointer_type *)(local_1e48._0_8_ + 0x78) = pBStack_1ba0;
    *(size_t *)(local_1e48._0_8_ + 0x80) = sStack_1b98;
    *(size_t *)(local_1e48._0_8_ + 0x88) = sStack_1b90;
    ((BBox1f *)(local_1e48._0_8_ + 0x90))->lower = (float)auStack_1b88._0_4_;
    ((BBox1f *)(local_1e48._0_8_ + 0x90))->upper = (float)auStack_1b88._4_4_;
    ((BBox1f *)(local_1e48._0_8_ + 0x98))->lower = (float)auStack_1b88._8_4_;
    ((BBox1f *)(local_1e48._0_8_ + 0x98))->upper = (float)auStack_1b88._12_4_;
    *(BBox1f *)(local_1e48._0_8_ + 0xa0) = local_1b78;
    uVar72 = *(undefined8 *)local_1e38;
    uVar17 = *(undefined8 *)((long)local_1e38 + 8);
    pSVar3->sah = (float)(int)uVar72;
    pSVar3->dim = (int)((ulong)uVar72 >> 0x20);
    *(undefined8 *)(local_1718 + lVar30 + 8) = uVar17;
    uVar47 = local_848;
    *(longlong *)(local_1e48._0_8_ + 0xc0) = local_1b58;
    *(longlong *)(local_1e48._0_8_ + 0xd0) = local_1b48;
    *(longlong *)(local_1e48._0_8_ + 0xd8) = lStack_1b40;
    *(longlong *)(local_1e48._0_8_ + 0xe0) = lStack_1b38;
    *(longlong *)(local_1e48._0_8_ + 0xe8) = lStack_1b30;
    lVar38 = local_848 * 0xf0;
    (&v0)[local_848 * 0xf].field_0.v[0] = geomID.field_0.v[0];
    *(undefined8 *)(&local_17b8 + uVar47 * 0xf) = local_1b18._0_8_;
    *(undefined8 *)((long)&local_17b8 + lVar38 + 8) = local_1b18._8_8_;
    *(undefined8 *)((long)&local_17a8 + uVar47 * 0xf0) = uStack_1b08;
    *(undefined8 *)((long)&local_17a8 + uVar47 * 0xf0 + 8) = uStack_1b00;
    *(undefined8 *)(&local_1798 + uVar47 * 0xf) = local_1af8;
    *(undefined8 *)((long)&local_1798 + lVar38 + 8) = uStack_1af0;
    *(undefined8 *)(&local_1788 + uVar47 * 0xf) = uStack_1ae8;
    *(undefined8 *)((long)&local_1788 + lVar38 + 8) = uStack_1ae0;
    *(undefined8 *)((long)&local_1778 + uVar47 * 0xf0) = local_1ad8;
    *(undefined8 *)((long)&local_1778 + uVar47 * 0xf0 + 8) = uStack_1ad0;
    *(undefined8 *)(&local_1768 + uVar47 * 0xf) = uStack_1ac8;
    *(undefined8 *)((long)&local_1768 + lVar38 + 8) = uStack_1ac0;
    (&local_1758)[uVar47 * 0x1e] = local_1ab8;
    (&aStack_1750)[uVar47 * 0x1e]._M_b._M_p = pBStack_1ab0;
    (&aStack_1750)[uVar47 * 0x1e + 1]._M_b._M_p = pBStack_1aa8;
    (&aStack_1750)[uVar47 * 0x1e + 2]._M_b._M_p = pBStack_1aa0;
    (&local_1738)[uVar47 * 0x1e].lower = (float)auStack_1a98._0_4_;
    (&local_1738)[uVar47 * 0x1e].upper = (float)auStack_1a98._4_4_;
    local_1728[uVar47 * 0x1e + -1].lower = (float)auStack_1a98._8_4_;
    local_1728[uVar47 * 0x1e + -1].upper = (float)auStack_1a98._12_4_;
    local_1728[uVar47 * 0x1e] = local_1a88;
    uVar72 = *(undefined8 *)(local_1e08._0_8_ + 8);
    *(undefined8 *)(local_1718 + lVar38) = *(undefined8 *)local_1e08._0_8_;
    *(undefined8 *)(local_1718 + lVar38 + 8) = uVar72;
    *(undefined8 *)((long)&stack0xffffffffffffe8f8 + uVar47 * 0x1e * 8) = local_1a68;
    *(undefined8 *)((long)&stack0xffffffffffffe8f8 + (uVar47 * 0x1e + 2) * 8) = local_1a58;
    *(undefined8 *)((long)local_16e8 + (uVar47 * 0xf + -1) * 0x10 + 8) = uStack_1a50;
    *(undefined8 *)(local_16e8 + uVar47 * 0xf) = uStack_1a48;
    *(undefined8 *)((long)local_16e8 + uVar47 * 0xf0 + 8) = uStack_1a40;
    local_848 = local_848 + 1;
    auStack_1b88 = auVar64;
    auStack_1a98 = auVar66;
    if (local_1e50 != (BBox1f)0x0) {
      uVar51 = &local_1e50;
      std::
      default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
      ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                    *)uVar51,
                   (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                    *)local_1e50);
    }
    bVar53 = bVar53 | bVar61;
  } while (local_848 < (this->cfg).branchingFactor);
  if (local_848 != 0) {
LAB_01319c81:
    puVar40 = &uStack_172c;
    uVar47 = local_848;
    do {
      auVar64 = vcmpps_avx(ZEXT416((uint)(local_1e20->prims).super_PrimInfoMB.time_range.lower),
                           ZEXT416(puVar40[-1]),1);
      auVar66 = vcmpps_avx(ZEXT416(*puVar40),
                           ZEXT416((uint)(local_1e20->prims).super_PrimInfoMB.time_range.upper),1);
      auVar64 = vorps_avx(auVar64,auVar66);
      bVar53 = bVar53 | auVar64[0];
      puVar40 = puVar40 + 0x3c;
      uVar47 = uVar47 - 1;
    } while (uVar47 != 0);
  }
LAB_01319cc8:
  pBVar135 = this;
  if ((bVar53 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0x1c0;
    pTVar9 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar9->alloc)._M_b._M_p) {
      geomID.field_0.v[1]._0_1_ = 1;
      geomID.field_0.v[0] = (longlong)pTVar9;
      MutexSys::lock(&pTVar9->mutex);
      if ((pTVar9->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar9->alloc1).bytesUsed + (pTVar9->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar9->alloc0).end + (pTVar9->alloc1).end) -
             ((pTVar9->alloc0).cur + (pTVar9->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar9->alloc1).bytesWasted + (pTVar9->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar71 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar9->alloc0).end = auVar71._0_8_;
      (pTVar9->alloc0).allocBlockSize = auVar71._8_8_;
      (pTVar9->alloc0).bytesUsed = auVar71._16_8_;
      (pTVar9->alloc0).bytesWasted = auVar71._24_8_;
      (pTVar9->alloc0).ptr = (char *)auVar71._0_8_;
      (pTVar9->alloc0).cur = auVar71._8_8_;
      (pTVar9->alloc0).end = auVar71._16_8_;
      (pTVar9->alloc0).allocBlockSize = auVar71._24_8_;
      auVar71 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar9->alloc1).end = auVar71._0_8_;
        (pTVar9->alloc1).allocBlockSize = auVar71._8_8_;
        (pTVar9->alloc1).bytesUsed = auVar71._16_8_;
        (pTVar9->alloc1).bytesWasted = auVar71._24_8_;
        (pTVar9->alloc1).ptr = (char *)auVar71._0_8_;
        (pTVar9->alloc1).cur = auVar71._8_8_;
        (pTVar9->alloc1).end = auVar71._16_8_;
        (pTVar9->alloc1).allocBlockSize = auVar71._24_8_;
      }
      else {
        (pTVar9->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar9->alloc1).ptr = (char *)auVar71._0_8_;
        (pTVar9->alloc1).cur = auVar71._8_8_;
        (pTVar9->alloc1).end = auVar71._16_8_;
        (pTVar9->alloc1).allocBlockSize = auVar71._24_8_;
        (pTVar9->alloc1).end = auVar71._0_8_;
        (pTVar9->alloc1).allocBlockSize = auVar71._8_8_;
        (pTVar9->alloc1).bytesUsed = auVar71._16_8_;
        (pTVar9->alloc1).bytesWasted = auVar71._24_8_;
        (pTVar9->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar9->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           pTVar9;
      v2.field_0.v[1]._0_1_ = 1;
      v2.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar10._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar10,(ThreadLocal2 **)&left);
      }
      else {
        *iVar10._M_current =
             (ThreadLocal2 *)
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (geomID.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)geomID.field_0.v[0]);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar34 = (alloc.talloc0)->cur;
    uVar47 = (ulong)(-(int)sVar34 & 0x1f);
    uVar58 = sVar34 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar47;
    (alloc.talloc0)->cur = uVar58;
    if ((alloc.talloc0)->end < uVar58) {
      (alloc.talloc0)->cur = sVar34;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
        (alloc.talloc0)->ptr = pcVar46;
        sVar34 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar34;
        (alloc.talloc0)->end = v2.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        this = pBVar135;
        if ((ulong)v2.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
          pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
          (alloc.talloc0)->ptr = pcVar46;
          sVar34 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar34;
          (alloc.talloc0)->end = v2.field_0.v[0];
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)v2.field_0.v[0] <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar46 = (char *)0x0;
            pBVar135 = this;
            goto LAB_0131a0d2;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar34;
        pBVar135 = this;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar47;
      pcVar46 = (alloc.talloc0)->ptr +
                (uVar58 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_0131a0d2:
    pcVar46[0xc0] = '\0';
    pcVar46[0xc1] = '\0';
    pcVar46[0xc2] = -0x80;
    pcVar46[0xc3] = '\x7f';
    pcVar46[0xc4] = '\0';
    pcVar46[0xc5] = '\0';
    pcVar46[0xc6] = -0x80;
    pcVar46[199] = '\x7f';
    pcVar46[200] = '\0';
    pcVar46[0xc9] = '\0';
    pcVar46[0xca] = -0x80;
    pcVar46[0xcb] = '\x7f';
    pcVar46[0xcc] = '\0';
    pcVar46[0xcd] = '\0';
    pcVar46[0xce] = -0x80;
    pcVar46[0xcf] = '\x7f';
    pcVar46[0xd0] = '\0';
    pcVar46[0xd1] = '\0';
    pcVar46[0xd2] = -0x80;
    pcVar46[0xd3] = '\x7f';
    pcVar46[0xd4] = '\0';
    pcVar46[0xd5] = '\0';
    pcVar46[0xd6] = -0x80;
    pcVar46[0xd7] = '\x7f';
    pcVar46[0xd8] = '\0';
    pcVar46[0xd9] = '\0';
    pcVar46[0xda] = -0x80;
    pcVar46[0xdb] = '\x7f';
    pcVar46[0xdc] = '\0';
    pcVar46[0xdd] = '\0';
    pcVar46[0xde] = -0x80;
    pcVar46[0xdf] = '\x7f';
    pcVar46[0x80] = '\0';
    pcVar46[0x81] = '\0';
    pcVar46[0x82] = -0x80;
    pcVar46[0x83] = '\x7f';
    pcVar46[0x84] = '\0';
    pcVar46[0x85] = '\0';
    pcVar46[0x86] = -0x80;
    pcVar46[0x87] = '\x7f';
    pcVar46[0x88] = '\0';
    pcVar46[0x89] = '\0';
    pcVar46[0x8a] = -0x80;
    pcVar46[0x8b] = '\x7f';
    pcVar46[0x8c] = '\0';
    pcVar46[0x8d] = '\0';
    pcVar46[0x8e] = -0x80;
    pcVar46[0x8f] = '\x7f';
    pcVar46[0x90] = '\0';
    pcVar46[0x91] = '\0';
    pcVar46[0x92] = -0x80;
    pcVar46[0x93] = '\x7f';
    pcVar46[0x94] = '\0';
    pcVar46[0x95] = '\0';
    pcVar46[0x96] = -0x80;
    pcVar46[0x97] = '\x7f';
    pcVar46[0x98] = '\0';
    pcVar46[0x99] = '\0';
    pcVar46[0x9a] = -0x80;
    pcVar46[0x9b] = '\x7f';
    pcVar46[0x9c] = '\0';
    pcVar46[0x9d] = '\0';
    pcVar46[0x9e] = -0x80;
    pcVar46[0x9f] = '\x7f';
    pcVar46[0x40] = '\0';
    pcVar46[0x41] = '\0';
    pcVar46[0x42] = -0x80;
    pcVar46[0x43] = '\x7f';
    pcVar46[0x44] = '\0';
    pcVar46[0x45] = '\0';
    pcVar46[0x46] = -0x80;
    pcVar46[0x47] = '\x7f';
    pcVar46[0x48] = '\0';
    pcVar46[0x49] = '\0';
    pcVar46[0x4a] = -0x80;
    pcVar46[0x4b] = '\x7f';
    pcVar46[0x4c] = '\0';
    pcVar46[0x4d] = '\0';
    pcVar46[0x4e] = -0x80;
    pcVar46[0x4f] = '\x7f';
    pcVar46[0x50] = '\0';
    pcVar46[0x51] = '\0';
    pcVar46[0x52] = -0x80;
    pcVar46[0x53] = '\x7f';
    pcVar46[0x54] = '\0';
    pcVar46[0x55] = '\0';
    pcVar46[0x56] = -0x80;
    pcVar46[0x57] = '\x7f';
    pcVar46[0x58] = '\0';
    pcVar46[0x59] = '\0';
    pcVar46[0x5a] = -0x80;
    pcVar46[0x5b] = '\x7f';
    pcVar46[0x5c] = '\0';
    pcVar46[0x5d] = '\0';
    pcVar46[0x5e] = -0x80;
    pcVar46[0x5f] = '\x7f';
    pcVar46[0xe0] = '\0';
    pcVar46[0xe1] = '\0';
    pcVar46[0xe2] = -0x80;
    pcVar46[0xe3] = -1;
    pcVar46[0xe4] = '\0';
    pcVar46[0xe5] = '\0';
    pcVar46[0xe6] = -0x80;
    pcVar46[0xe7] = -1;
    pcVar46[0xe8] = '\0';
    pcVar46[0xe9] = '\0';
    pcVar46[0xea] = -0x80;
    pcVar46[0xeb] = -1;
    pcVar46[0xec] = '\0';
    pcVar46[0xed] = '\0';
    pcVar46[0xee] = -0x80;
    pcVar46[0xef] = -1;
    pcVar46[0xf0] = '\0';
    pcVar46[0xf1] = '\0';
    pcVar46[0xf2] = -0x80;
    pcVar46[0xf3] = -1;
    pcVar46[0xf4] = '\0';
    pcVar46[0xf5] = '\0';
    pcVar46[0xf6] = -0x80;
    pcVar46[0xf7] = -1;
    pcVar46[0xf8] = '\0';
    pcVar46[0xf9] = '\0';
    pcVar46[0xfa] = -0x80;
    pcVar46[0xfb] = -1;
    pcVar46[0xfc] = '\0';
    pcVar46[0xfd] = '\0';
    pcVar46[0xfe] = -0x80;
    pcVar46[0xff] = -1;
    pcVar46[0xa0] = '\0';
    pcVar46[0xa1] = '\0';
    pcVar46[0xa2] = -0x80;
    pcVar46[0xa3] = -1;
    pcVar46[0xa4] = '\0';
    pcVar46[0xa5] = '\0';
    pcVar46[0xa6] = -0x80;
    pcVar46[0xa7] = -1;
    pcVar46[0xa8] = '\0';
    pcVar46[0xa9] = '\0';
    pcVar46[0xaa] = -0x80;
    pcVar46[0xab] = -1;
    pcVar46[0xac] = '\0';
    pcVar46[0xad] = '\0';
    pcVar46[0xae] = -0x80;
    pcVar46[0xaf] = -1;
    pcVar46[0xb0] = '\0';
    pcVar46[0xb1] = '\0';
    pcVar46[0xb2] = -0x80;
    pcVar46[0xb3] = -1;
    pcVar46[0xb4] = '\0';
    pcVar46[0xb5] = '\0';
    pcVar46[0xb6] = -0x80;
    pcVar46[0xb7] = -1;
    pcVar46[0xb8] = '\0';
    pcVar46[0xb9] = '\0';
    pcVar46[0xba] = -0x80;
    pcVar46[0xbb] = -1;
    pcVar46[0xbc] = '\0';
    pcVar46[0xbd] = '\0';
    pcVar46[0xbe] = -0x80;
    pcVar46[0xbf] = -1;
    pcVar46[0x60] = '\0';
    pcVar46[0x61] = '\0';
    pcVar46[0x62] = -0x80;
    pcVar46[99] = -1;
    pcVar46[100] = '\0';
    pcVar46[0x65] = '\0';
    pcVar46[0x66] = -0x80;
    pcVar46[0x67] = -1;
    pcVar46[0x68] = '\0';
    pcVar46[0x69] = '\0';
    pcVar46[0x6a] = -0x80;
    pcVar46[0x6b] = -1;
    pcVar46[0x6c] = '\0';
    pcVar46[0x6d] = '\0';
    pcVar46[0x6e] = -0x80;
    pcVar46[0x6f] = -1;
    pcVar46[0x70] = '\0';
    pcVar46[0x71] = '\0';
    pcVar46[0x72] = -0x80;
    pcVar46[0x73] = -1;
    pcVar46[0x74] = '\0';
    pcVar46[0x75] = '\0';
    pcVar46[0x76] = -0x80;
    pcVar46[0x77] = -1;
    pcVar46[0x78] = '\0';
    pcVar46[0x79] = '\0';
    pcVar46[0x7a] = -0x80;
    pcVar46[0x7b] = -1;
    pcVar46[0x7c] = '\0';
    pcVar46[0x7d] = '\0';
    pcVar46[0x7e] = -0x80;
    pcVar46[0x7f] = -1;
    auVar71 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar46 + 0x100) = auVar71;
    *(undefined1 (*) [32])(pcVar46 + 0x120) = auVar71;
    auVar71 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar46 + 0x140) = auVar71;
    *(undefined1 (*) [32])(pcVar46 + 0x160) = auVar71;
    *(undefined1 (*) [32])(pcVar46 + 0x180) = auVar71;
    *(undefined1 (*) [32])(pcVar46 + 0x1a0) = auVar71;
    pcVar46[0] = '\b';
    pcVar46[1] = '\0';
    pcVar46[2] = '\0';
    pcVar46[3] = '\0';
    pcVar46[4] = '\0';
    pcVar46[5] = '\0';
    pcVar46[6] = '\0';
    pcVar46[7] = '\0';
    pcVar46[8] = '\b';
    pcVar46[9] = '\0';
    pcVar46[10] = '\0';
    pcVar46[0xb] = '\0';
    pcVar46[0xc] = '\0';
    pcVar46[0xd] = '\0';
    pcVar46[0xe] = '\0';
    pcVar46[0xf] = '\0';
    pcVar46[0x10] = '\b';
    pcVar46[0x11] = '\0';
    pcVar46[0x12] = '\0';
    pcVar46[0x13] = '\0';
    pcVar46[0x14] = '\0';
    pcVar46[0x15] = '\0';
    pcVar46[0x16] = '\0';
    pcVar46[0x17] = '\0';
    pcVar46[0x18] = '\b';
    pcVar46[0x19] = '\0';
    pcVar46[0x1a] = '\0';
    pcVar46[0x1b] = '\0';
    pcVar46[0x1c] = '\0';
    pcVar46[0x1d] = '\0';
    pcVar46[0x1e] = '\0';
    pcVar46[0x1f] = '\0';
    pcVar46[0x20] = '\b';
    pcVar46[0x21] = '\0';
    pcVar46[0x22] = '\0';
    pcVar46[0x23] = '\0';
    pcVar46[0x24] = '\0';
    pcVar46[0x25] = '\0';
    pcVar46[0x26] = '\0';
    pcVar46[0x27] = '\0';
    pcVar46[0x28] = '\b';
    pcVar46[0x29] = '\0';
    pcVar46[0x2a] = '\0';
    pcVar46[0x2b] = '\0';
    pcVar46[0x2c] = '\0';
    pcVar46[0x2d] = '\0';
    pcVar46[0x2e] = '\0';
    pcVar46[0x2f] = '\0';
    pcVar46[0x30] = '\b';
    pcVar46[0x31] = '\0';
    pcVar46[0x32] = '\0';
    pcVar46[0x33] = '\0';
    pcVar46[0x34] = '\0';
    pcVar46[0x35] = '\0';
    pcVar46[0x36] = '\0';
    pcVar46[0x37] = '\0';
    pcVar46[0x38] = '\b';
    pcVar46[0x39] = '\0';
    pcVar46[0x3a] = '\0';
    pcVar46[0x3b] = '\0';
    pcVar46[0x3c] = '\0';
    pcVar46[0x3d] = '\0';
    pcVar46[0x3e] = '\0';
    pcVar46[0x3f] = '\0';
    uVar58 = 1;
    uVar47 = 0;
    goto LAB_0131a15c;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x200;
  pTVar9 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar9->alloc)._M_b._M_p) {
    geomID.field_0.v[1]._0_1_ = 1;
    geomID.field_0.v[0] = (longlong)pTVar9;
    MutexSys::lock(&pTVar9->mutex);
    if ((pTVar9->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar9->alloc1).bytesUsed + (pTVar9->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar9->alloc0).end + (pTVar9->alloc1).end) -
           ((pTVar9->alloc0).cur + (pTVar9->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar9->alloc1).bytesWasted + (pTVar9->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar71 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar9->alloc0).end = auVar71._0_8_;
    (pTVar9->alloc0).allocBlockSize = auVar71._8_8_;
    (pTVar9->alloc0).bytesUsed = auVar71._16_8_;
    (pTVar9->alloc0).bytesWasted = auVar71._24_8_;
    (pTVar9->alloc0).ptr = (char *)auVar71._0_8_;
    (pTVar9->alloc0).cur = auVar71._8_8_;
    (pTVar9->alloc0).end = auVar71._16_8_;
    (pTVar9->alloc0).allocBlockSize = auVar71._24_8_;
    auVar71 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar9->alloc1).end = auVar71._0_8_;
      (pTVar9->alloc1).allocBlockSize = auVar71._8_8_;
      (pTVar9->alloc1).bytesUsed = auVar71._16_8_;
      (pTVar9->alloc1).bytesWasted = auVar71._24_8_;
      (pTVar9->alloc1).ptr = (char *)auVar71._0_8_;
      (pTVar9->alloc1).cur = auVar71._8_8_;
      (pTVar9->alloc1).end = auVar71._16_8_;
      (pTVar9->alloc1).allocBlockSize = auVar71._24_8_;
    }
    else {
      (pTVar9->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar9->alloc1).ptr = (char *)auVar71._0_8_;
      (pTVar9->alloc1).cur = auVar71._8_8_;
      (pTVar9->alloc1).end = auVar71._16_8_;
      (pTVar9->alloc1).allocBlockSize = auVar71._24_8_;
      (pTVar9->alloc1).end = auVar71._0_8_;
      (pTVar9->alloc1).allocBlockSize = auVar71._8_8_;
      (pTVar9->alloc1).bytesUsed = auVar71._16_8_;
      (pTVar9->alloc1).bytesWasted = auVar71._24_8_;
      (pTVar9->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar9->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         pTVar9;
    v2.field_0.v[1]._0_1_ = 1;
    v2.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar10._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar10,(ThreadLocal2 **)&left);
    }
    else {
      *iVar10._M_current =
           (ThreadLocal2 *)
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    uVar51 = &FastAllocator::s_thread_local_allocators_lock;
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (geomID.field_0.v[1]._0_1_ == '\x01') {
      uVar51 = geomID.field_0.v[0];
      MutexSys::unlock((MutexSys *)geomID.field_0.v[0]);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar34 = (alloc.talloc0)->cur;
  uVar47 = (ulong)(-(int)sVar34 & 0x1f);
  uVar58 = sVar34 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar47;
  (alloc.talloc0)->cur = uVar58;
  if ((alloc.talloc0)->end < uVar58) {
    (alloc.talloc0)->cur = sVar34;
    uVar51 = alloc.alloc;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
      pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
      (alloc.talloc0)->ptr = pcVar46;
      sVar34 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar34;
      (alloc.talloc0)->end = v2.field_0.v[0];
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      this = pBVar135;
      if ((ulong)v2.field_0.v[0] <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        uVar51 = alloc.alloc;
        pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
        (alloc.talloc0)->ptr = pcVar46;
        sVar34 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar34;
        (alloc.talloc0)->end = v2.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v2.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar46 = (char *)0x0;
          pBVar135 = this;
          goto LAB_01319fc4;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar34;
      pBVar135 = this;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar47;
    pcVar46 = (alloc.talloc0)->ptr +
              (uVar58 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_01319fc4:
  pcVar46[0x1c0] = '\0';
  pcVar46[0x1c1] = '\0';
  pcVar46[0x1c2] = -0x80;
  pcVar46[0x1c3] = '\x7f';
  pcVar46[0x1c4] = '\0';
  pcVar46[0x1c5] = '\0';
  pcVar46[0x1c6] = -0x80;
  pcVar46[0x1c7] = '\x7f';
  pcVar46[0x1c8] = '\0';
  pcVar46[0x1c9] = '\0';
  pcVar46[0x1ca] = -0x80;
  pcVar46[0x1cb] = '\x7f';
  pcVar46[0x1cc] = '\0';
  pcVar46[0x1cd] = '\0';
  pcVar46[0x1ce] = -0x80;
  pcVar46[0x1cf] = '\x7f';
  pcVar46[0x1d0] = '\0';
  pcVar46[0x1d1] = '\0';
  pcVar46[0x1d2] = -0x80;
  pcVar46[0x1d3] = '\x7f';
  pcVar46[0x1d4] = '\0';
  pcVar46[0x1d5] = '\0';
  pcVar46[0x1d6] = -0x80;
  pcVar46[0x1d7] = '\x7f';
  pcVar46[0x1d8] = '\0';
  pcVar46[0x1d9] = '\0';
  pcVar46[0x1da] = -0x80;
  pcVar46[0x1db] = '\x7f';
  pcVar46[0x1dc] = '\0';
  pcVar46[0x1dd] = '\0';
  pcVar46[0x1de] = -0x80;
  pcVar46[0x1df] = '\x7f';
  pcVar46[0x1e0] = '\0';
  pcVar46[0x1e1] = '\0';
  pcVar46[0x1e2] = -0x80;
  pcVar46[0x1e3] = -1;
  pcVar46[0x1e4] = '\0';
  pcVar46[0x1e5] = '\0';
  pcVar46[0x1e6] = -0x80;
  pcVar46[0x1e7] = -1;
  pcVar46[0x1e8] = '\0';
  pcVar46[0x1e9] = '\0';
  pcVar46[0x1ea] = -0x80;
  pcVar46[0x1eb] = -1;
  pcVar46[0x1ec] = '\0';
  pcVar46[0x1ed] = '\0';
  pcVar46[0x1ee] = -0x80;
  pcVar46[0x1ef] = -1;
  pcVar46[0x1f0] = '\0';
  pcVar46[0x1f1] = '\0';
  pcVar46[0x1f2] = -0x80;
  pcVar46[499] = -1;
  pcVar46[500] = '\0';
  pcVar46[0x1f5] = '\0';
  pcVar46[0x1f6] = -0x80;
  pcVar46[0x1f7] = -1;
  pcVar46[0x1f8] = '\0';
  pcVar46[0x1f9] = '\0';
  pcVar46[0x1fa] = -0x80;
  pcVar46[0x1fb] = -1;
  pcVar46[0x1fc] = '\0';
  pcVar46[0x1fd] = '\0';
  pcVar46[0x1fe] = -0x80;
  pcVar46[0x1ff] = -1;
  pcVar46[0xc0] = '\0';
  pcVar46[0xc1] = '\0';
  pcVar46[0xc2] = -0x80;
  pcVar46[0xc3] = '\x7f';
  pcVar46[0xc4] = '\0';
  pcVar46[0xc5] = '\0';
  pcVar46[0xc6] = -0x80;
  pcVar46[199] = '\x7f';
  pcVar46[200] = '\0';
  pcVar46[0xc9] = '\0';
  pcVar46[0xca] = -0x80;
  pcVar46[0xcb] = '\x7f';
  pcVar46[0xcc] = '\0';
  pcVar46[0xcd] = '\0';
  pcVar46[0xce] = -0x80;
  pcVar46[0xcf] = '\x7f';
  pcVar46[0xd0] = '\0';
  pcVar46[0xd1] = '\0';
  pcVar46[0xd2] = -0x80;
  pcVar46[0xd3] = '\x7f';
  pcVar46[0xd4] = '\0';
  pcVar46[0xd5] = '\0';
  pcVar46[0xd6] = -0x80;
  pcVar46[0xd7] = '\x7f';
  pcVar46[0xd8] = '\0';
  pcVar46[0xd9] = '\0';
  pcVar46[0xda] = -0x80;
  pcVar46[0xdb] = '\x7f';
  pcVar46[0xdc] = '\0';
  pcVar46[0xdd] = '\0';
  pcVar46[0xde] = -0x80;
  pcVar46[0xdf] = '\x7f';
  pcVar46[0x80] = '\0';
  pcVar46[0x81] = '\0';
  pcVar46[0x82] = -0x80;
  pcVar46[0x83] = '\x7f';
  pcVar46[0x84] = '\0';
  pcVar46[0x85] = '\0';
  pcVar46[0x86] = -0x80;
  pcVar46[0x87] = '\x7f';
  pcVar46[0x88] = '\0';
  pcVar46[0x89] = '\0';
  pcVar46[0x8a] = -0x80;
  pcVar46[0x8b] = '\x7f';
  pcVar46[0x8c] = '\0';
  pcVar46[0x8d] = '\0';
  pcVar46[0x8e] = -0x80;
  pcVar46[0x8f] = '\x7f';
  pcVar46[0x90] = '\0';
  pcVar46[0x91] = '\0';
  pcVar46[0x92] = -0x80;
  pcVar46[0x93] = '\x7f';
  pcVar46[0x94] = '\0';
  pcVar46[0x95] = '\0';
  pcVar46[0x96] = -0x80;
  pcVar46[0x97] = '\x7f';
  pcVar46[0x98] = '\0';
  pcVar46[0x99] = '\0';
  pcVar46[0x9a] = -0x80;
  pcVar46[0x9b] = '\x7f';
  pcVar46[0x9c] = '\0';
  pcVar46[0x9d] = '\0';
  pcVar46[0x9e] = -0x80;
  pcVar46[0x9f] = '\x7f';
  pcVar46[0x40] = '\0';
  pcVar46[0x41] = '\0';
  pcVar46[0x42] = -0x80;
  pcVar46[0x43] = '\x7f';
  pcVar46[0x44] = '\0';
  pcVar46[0x45] = '\0';
  pcVar46[0x46] = -0x80;
  pcVar46[0x47] = '\x7f';
  pcVar46[0x48] = '\0';
  pcVar46[0x49] = '\0';
  pcVar46[0x4a] = -0x80;
  pcVar46[0x4b] = '\x7f';
  pcVar46[0x4c] = '\0';
  pcVar46[0x4d] = '\0';
  pcVar46[0x4e] = -0x80;
  pcVar46[0x4f] = '\x7f';
  pcVar46[0x50] = '\0';
  pcVar46[0x51] = '\0';
  pcVar46[0x52] = -0x80;
  pcVar46[0x53] = '\x7f';
  pcVar46[0x54] = '\0';
  pcVar46[0x55] = '\0';
  pcVar46[0x56] = -0x80;
  pcVar46[0x57] = '\x7f';
  pcVar46[0x58] = '\0';
  pcVar46[0x59] = '\0';
  pcVar46[0x5a] = -0x80;
  pcVar46[0x5b] = '\x7f';
  pcVar46[0x5c] = '\0';
  pcVar46[0x5d] = '\0';
  pcVar46[0x5e] = -0x80;
  pcVar46[0x5f] = '\x7f';
  pcVar46[0xe0] = '\0';
  pcVar46[0xe1] = '\0';
  pcVar46[0xe2] = -0x80;
  pcVar46[0xe3] = -1;
  pcVar46[0xe4] = '\0';
  pcVar46[0xe5] = '\0';
  pcVar46[0xe6] = -0x80;
  pcVar46[0xe7] = -1;
  pcVar46[0xe8] = '\0';
  pcVar46[0xe9] = '\0';
  pcVar46[0xea] = -0x80;
  pcVar46[0xeb] = -1;
  pcVar46[0xec] = '\0';
  pcVar46[0xed] = '\0';
  pcVar46[0xee] = -0x80;
  pcVar46[0xef] = -1;
  pcVar46[0xf0] = '\0';
  pcVar46[0xf1] = '\0';
  pcVar46[0xf2] = -0x80;
  pcVar46[0xf3] = -1;
  pcVar46[0xf4] = '\0';
  pcVar46[0xf5] = '\0';
  pcVar46[0xf6] = -0x80;
  pcVar46[0xf7] = -1;
  pcVar46[0xf8] = '\0';
  pcVar46[0xf9] = '\0';
  pcVar46[0xfa] = -0x80;
  pcVar46[0xfb] = -1;
  pcVar46[0xfc] = '\0';
  pcVar46[0xfd] = '\0';
  pcVar46[0xfe] = -0x80;
  pcVar46[0xff] = -1;
  pcVar46[0xa0] = '\0';
  pcVar46[0xa1] = '\0';
  pcVar46[0xa2] = -0x80;
  pcVar46[0xa3] = -1;
  pcVar46[0xa4] = '\0';
  pcVar46[0xa5] = '\0';
  pcVar46[0xa6] = -0x80;
  pcVar46[0xa7] = -1;
  pcVar46[0xa8] = '\0';
  pcVar46[0xa9] = '\0';
  pcVar46[0xaa] = -0x80;
  pcVar46[0xab] = -1;
  pcVar46[0xac] = '\0';
  pcVar46[0xad] = '\0';
  pcVar46[0xae] = -0x80;
  pcVar46[0xaf] = -1;
  pcVar46[0xb0] = '\0';
  pcVar46[0xb1] = '\0';
  pcVar46[0xb2] = -0x80;
  pcVar46[0xb3] = -1;
  pcVar46[0xb4] = '\0';
  pcVar46[0xb5] = '\0';
  pcVar46[0xb6] = -0x80;
  pcVar46[0xb7] = -1;
  pcVar46[0xb8] = '\0';
  pcVar46[0xb9] = '\0';
  pcVar46[0xba] = -0x80;
  pcVar46[0xbb] = -1;
  pcVar46[0xbc] = '\0';
  pcVar46[0xbd] = '\0';
  pcVar46[0xbe] = -0x80;
  pcVar46[0xbf] = -1;
  pcVar46[0x60] = '\0';
  pcVar46[0x61] = '\0';
  pcVar46[0x62] = -0x80;
  pcVar46[99] = -1;
  pcVar46[100] = '\0';
  pcVar46[0x65] = '\0';
  pcVar46[0x66] = -0x80;
  pcVar46[0x67] = -1;
  pcVar46[0x68] = '\0';
  pcVar46[0x69] = '\0';
  pcVar46[0x6a] = -0x80;
  pcVar46[0x6b] = -1;
  pcVar46[0x6c] = '\0';
  pcVar46[0x6d] = '\0';
  pcVar46[0x6e] = -0x80;
  pcVar46[0x6f] = -1;
  pcVar46[0x70] = '\0';
  pcVar46[0x71] = '\0';
  pcVar46[0x72] = -0x80;
  pcVar46[0x73] = -1;
  pcVar46[0x74] = '\0';
  pcVar46[0x75] = '\0';
  pcVar46[0x76] = -0x80;
  pcVar46[0x77] = -1;
  pcVar46[0x78] = '\0';
  pcVar46[0x79] = '\0';
  pcVar46[0x7a] = -0x80;
  pcVar46[0x7b] = -1;
  pcVar46[0x7c] = '\0';
  pcVar46[0x7d] = '\0';
  pcVar46[0x7e] = -0x80;
  pcVar46[0x7f] = -1;
  auVar71 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar46 + 0x100) = auVar71;
  *(undefined1 (*) [32])(pcVar46 + 0x120) = auVar71;
  auVar71 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar46 + 0x140) = auVar71;
  *(undefined1 (*) [32])(pcVar46 + 0x160) = auVar71;
  *(undefined1 (*) [32])(pcVar46 + 0x180) = auVar71;
  *(undefined1 (*) [32])(pcVar46 + 0x1a0) = auVar71;
  pcVar46[0] = '\b';
  pcVar46[1] = '\0';
  pcVar46[2] = '\0';
  pcVar46[3] = '\0';
  pcVar46[4] = '\0';
  pcVar46[5] = '\0';
  pcVar46[6] = '\0';
  pcVar46[7] = '\0';
  pcVar46[8] = '\b';
  pcVar46[9] = '\0';
  pcVar46[10] = '\0';
  pcVar46[0xb] = '\0';
  pcVar46[0xc] = '\0';
  pcVar46[0xd] = '\0';
  pcVar46[0xe] = '\0';
  pcVar46[0xf] = '\0';
  pcVar46[0x10] = '\b';
  pcVar46[0x11] = '\0';
  pcVar46[0x12] = '\0';
  pcVar46[0x13] = '\0';
  pcVar46[0x14] = '\0';
  pcVar46[0x15] = '\0';
  pcVar46[0x16] = '\0';
  pcVar46[0x17] = '\0';
  pcVar46[0x18] = '\b';
  pcVar46[0x19] = '\0';
  pcVar46[0x1a] = '\0';
  pcVar46[0x1b] = '\0';
  pcVar46[0x1c] = '\0';
  pcVar46[0x1d] = '\0';
  pcVar46[0x1e] = '\0';
  pcVar46[0x1f] = '\0';
  pcVar46[0x20] = '\b';
  pcVar46[0x21] = '\0';
  pcVar46[0x22] = '\0';
  pcVar46[0x23] = '\0';
  pcVar46[0x24] = '\0';
  pcVar46[0x25] = '\0';
  pcVar46[0x26] = '\0';
  pcVar46[0x27] = '\0';
  pcVar46[0x28] = '\b';
  pcVar46[0x29] = '\0';
  pcVar46[0x2a] = '\0';
  pcVar46[0x2b] = '\0';
  pcVar46[0x2c] = '\0';
  pcVar46[0x2d] = '\0';
  pcVar46[0x2e] = '\0';
  pcVar46[0x2f] = '\0';
  pcVar46[0x30] = '\b';
  pcVar46[0x31] = '\0';
  pcVar46[0x32] = '\0';
  pcVar46[0x33] = '\0';
  pcVar46[0x34] = '\0';
  pcVar46[0x35] = '\0';
  pcVar46[0x36] = '\0';
  pcVar46[0x37] = '\0';
  pcVar46[0x38] = '\b';
  pcVar46[0x39] = '\0';
  pcVar46[0x3a] = '\0';
  pcVar46[0x3b] = '\0';
  pcVar46[0x3c] = '\0';
  pcVar46[0x3d] = '\0';
  pcVar46[0x3e] = '\0';
  pcVar46[0x3f] = '\0';
  uVar47 = CONCAT71(SUB87(uVar51,1),1);
  uVar58 = 6;
LAB_0131a15c:
  local_1e48.i[2] = 0xff800000;
  local_1e48._0_8_ = 0xff800000ff800000;
  local_1e48.i[3] = 0xff800000;
  fVar73 = INFINITY;
  fVar107 = INFINITY;
  fVar101 = INFINITY;
  fVar113 = INFINITY;
  if (local_848 != 0) {
    local_1e08.m128[0] = (float)(int)uVar47;
    pBVar37 = &values[0].dt;
    uVar47 = 0;
    local_1db8.i[2] = 0x7f800000;
    local_1db8._0_8_ = 0x7f8000007f800000;
    local_1db8.i[3] = 0x7f800000;
    fStack_1e30 = INFINITY;
    local_1e38 = (undefined1  [8])0x7f8000007f800000;
    fStack_1e2c = INFINITY;
    local_1da8.i[2] = 0xff800000;
    local_1da8._0_8_ = 0xff800000ff800000;
    local_1da8.i[3] = 0xff800000;
    local_1e48.i[2] = 0xff800000;
    local_1e48._0_8_ = 0xff800000ff800000;
    local_1e48.i[3] = 0xff800000;
    in_00 = (BuildRecord *)&v0;
    this = pBVar135;
    do {
      createLargeLeaf((NodeRecordMB4D *)&v2,this,in_00,alloc);
      vVar24 = v2;
      pBVar37[-10].lower = (float)v2.field_0.v[0]._0_4_;
      pBVar37[-10].upper = (float)v2.field_0._4_4_;
      auVar18._8_8_ = local_1c08._8_8_;
      auVar18._0_8_ = local_1c08._0_8_;
      *(undefined1 (*) [16])(pBVar37 + -8) = auVar18;
      auVar19._8_8_ = auStack_1bf8._8_8_;
      auVar19._0_8_ = auStack_1bf8._0_8_;
      *(undefined1 (*) [16])(pBVar37 + -6) = auVar19;
      auVar20._8_8_ = local_1be8._8_8_;
      auVar20._0_8_ = local_1be8._0_8_;
      *(undefined1 (*) [16])(pBVar37 + -4) = auVar20;
      auVar21._8_8_ = aStack_1bd8._8_8_;
      auVar21._0_8_ = aStack_1bd8._0_8_;
      *(undefined1 (*) [16])(pBVar37 + -2) = auVar21;
      pBVar37->lower = (float)local_1bc8._0_4_;
      pBVar37->upper = local_1bc8.m128[1];
      local_1db8.v = (__m128)vminps_avx(local_1db8.v,auVar18);
      local_1da8.v = (__m128)vmaxps_avx(local_1da8.v,auVar19);
      _local_1e38 = (__m128)vminps_avx(_local_1e38,auVar20);
      local_1e48.v = (__m128)vmaxps_avx(local_1e48.v,auVar21);
      uVar47 = uVar47 + 1;
      pBVar37 = pBVar37 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
      v2 = vVar24;
    } while (uVar47 < local_848);
    if (((uint)uVar58 | (uint)pcVar46 & 0xf) == 1) {
      if (local_848 != 0) {
        uVar47 = (ulong)pcVar46 & 0xfffffffffffffff0;
        pfVar43 = &values[0].dt.upper;
        lVar38 = 0;
        auVar84._8_4_ = 0x7f7fffff;
        auVar84._0_8_ = 0x7f7fffff7f7fffff;
        auVar84._12_4_ = 0x7f7fffff;
        auVar87._8_4_ = 0xff7fffff;
        auVar87._0_8_ = 0xff7fffffff7fffff;
        auVar87._12_4_ = 0xff7fffff;
        auVar94._8_4_ = 0x7fffffff;
        auVar94._0_8_ = 0x7fffffff7fffffff;
        auVar94._12_4_ = 0x7fffffff;
        do {
          *(undefined8 *)(uVar47 + lVar38 * 8) = *(undefined8 *)(pfVar43 + -0x15);
          fVar73 = ((BBox1f *)(pfVar43 + -1))->lower;
          fVar101 = 1.0 / (*pfVar43 - fVar73);
          fVar107 = -fVar73 * fVar101;
          auVar64 = vshufps_avx(ZEXT416((uint)fVar107),ZEXT416((uint)fVar107),0);
          auVar66 = vshufps_avx(ZEXT416((uint)(1.0 - fVar107)),ZEXT416((uint)(1.0 - fVar107)),0);
          auVar129._0_4_ = pfVar43[-9] * auVar64._0_4_ + pfVar43[-0x11] * auVar66._0_4_;
          auVar129._4_4_ = pfVar43[-8] * auVar64._4_4_ + pfVar43[-0x10] * auVar66._4_4_;
          auVar129._8_4_ = pfVar43[-7] * auVar64._8_4_ + pfVar43[-0xf] * auVar66._8_4_;
          auVar129._12_4_ = pfVar43[-6] * auVar64._12_4_ + pfVar43[-0xe] * auVar66._12_4_;
          auVar108._0_4_ = pfVar43[-5] * auVar64._0_4_ + pfVar43[-0xd] * auVar66._0_4_;
          auVar108._4_4_ = pfVar43[-4] * auVar64._4_4_ + pfVar43[-0xc] * auVar66._4_4_;
          auVar108._8_4_ = pfVar43[-3] * auVar64._8_4_ + pfVar43[-0xb] * auVar66._8_4_;
          auVar108._12_4_ = pfVar43[-2] * auVar64._12_4_ + pfVar43[-10] * auVar66._12_4_;
          fVar101 = (1.0 - fVar73) * fVar101;
          auVar64 = vshufps_avx(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101),0);
          auVar66 = vshufps_avx(ZEXT416((uint)(1.0 - fVar101)),ZEXT416((uint)(1.0 - fVar101)),0);
          auVar114._0_4_ = pfVar43[-9] * auVar64._0_4_ + pfVar43[-0x11] * auVar66._0_4_;
          auVar114._4_4_ = pfVar43[-8] * auVar64._4_4_ + pfVar43[-0x10] * auVar66._4_4_;
          auVar114._8_4_ = pfVar43[-7] * auVar64._8_4_ + pfVar43[-0xf] * auVar66._8_4_;
          auVar114._12_4_ = pfVar43[-6] * auVar64._12_4_ + pfVar43[-0xe] * auVar66._12_4_;
          auVar102._0_4_ = pfVar43[-5] * auVar64._0_4_ + pfVar43[-0xd] * auVar66._0_4_;
          auVar102._4_4_ = pfVar43[-4] * auVar64._4_4_ + pfVar43[-0xc] * auVar66._4_4_;
          auVar102._8_4_ = pfVar43[-3] * auVar64._8_4_ + pfVar43[-0xb] * auVar66._8_4_;
          auVar102._12_4_ = pfVar43[-2] * auVar64._12_4_ + pfVar43[-10] * auVar66._12_4_;
          auVar79 = vminps_avx(auVar129,auVar84);
          auVar66 = vmaxps_avx(auVar108,auVar87);
          auVar76 = vminps_avx(auVar114,auVar84);
          auVar65 = vmaxps_avx(auVar102,auVar87);
          auVar64 = vandps_avx(auVar79,auVar94);
          auVar118._0_4_ = auVar64._0_4_ * 4.7683716e-07;
          auVar118._4_4_ = auVar64._4_4_ * 4.7683716e-07;
          auVar118._8_4_ = auVar64._8_4_ * 4.7683716e-07;
          auVar118._12_4_ = auVar64._12_4_ * 4.7683716e-07;
          auVar79 = vsubps_avx(auVar79,auVar118);
          auVar64 = vandps_avx(auVar66,auVar94);
          auVar109._0_4_ = auVar66._0_4_ + auVar64._0_4_ * 4.7683716e-07;
          auVar109._4_4_ = auVar66._4_4_ + auVar64._4_4_ * 4.7683716e-07;
          auVar109._8_4_ = auVar66._8_4_ + auVar64._8_4_ * 4.7683716e-07;
          auVar109._12_4_ = auVar66._12_4_ + auVar64._12_4_ * 4.7683716e-07;
          auVar64 = vandps_avx(auVar76,auVar94);
          auVar119._0_4_ = auVar64._0_4_ * 4.7683716e-07;
          auVar119._4_4_ = auVar64._4_4_ * 4.7683716e-07;
          auVar119._8_4_ = auVar64._8_4_ * 4.7683716e-07;
          auVar119._12_4_ = auVar64._12_4_ * 4.7683716e-07;
          auVar66 = vsubps_avx(auVar76,auVar119);
          auVar64 = vandps_avx(auVar65,auVar94);
          *(int *)(uVar47 + 0x40 + lVar38 * 4) = auVar79._0_4_;
          uVar6 = vextractps_avx(auVar79,1);
          *(undefined4 *)(uVar47 + 0x80 + lVar38 * 4) = uVar6;
          auVar103._0_4_ = auVar64._0_4_ * 4.7683716e-07 + auVar65._0_4_;
          auVar103._4_4_ = auVar64._4_4_ * 4.7683716e-07 + auVar65._4_4_;
          auVar103._8_4_ = auVar64._8_4_ * 4.7683716e-07 + auVar65._8_4_;
          auVar103._12_4_ = auVar64._12_4_ * 4.7683716e-07 + auVar65._12_4_;
          uVar6 = vextractps_avx(auVar79,2);
          *(undefined4 *)(uVar47 + 0xc0 + lVar38 * 4) = uVar6;
          *(float *)(uVar47 + 0x60 + lVar38 * 4) = auVar109._0_4_;
          uVar6 = vextractps_avx(auVar109,1);
          *(undefined4 *)(uVar47 + 0xa0 + lVar38 * 4) = uVar6;
          auVar64 = vsubps_avx(auVar66,auVar79);
          uVar6 = vextractps_avx(auVar109,2);
          *(undefined4 *)(uVar47 + 0xe0 + lVar38 * 4) = uVar6;
          *(int *)(uVar47 + 0x100 + lVar38 * 4) = auVar64._0_4_;
          uVar6 = vextractps_avx(auVar64,1);
          *(undefined4 *)(uVar47 + 0x140 + lVar38 * 4) = uVar6;
          auVar66 = vsubps_avx(auVar103,auVar109);
          uVar6 = vextractps_avx(auVar64,2);
          *(undefined4 *)(uVar47 + 0x180 + lVar38 * 4) = uVar6;
          *(int *)(uVar47 + 0x120 + lVar38 * 4) = auVar66._0_4_;
          uVar6 = vextractps_avx(auVar66,1);
          *(undefined4 *)(uVar47 + 0x160 + lVar38 * 4) = uVar6;
          uVar6 = vextractps_avx(auVar66,2);
          *(undefined4 *)(uVar47 + 0x1a0 + lVar38 * 4) = uVar6;
          lVar38 = lVar38 + 1;
          pfVar43 = pfVar43 + 0x18;
        } while (local_848 != lVar38);
      }
    }
    else if (local_848 != 0) {
      uVar47 = (ulong)pcVar46 & 0xfffffffffffffff0;
      pfVar43 = &values[0].dt.upper;
      lVar38 = 0;
      auVar85._8_4_ = 0x7f7fffff;
      auVar85._0_8_ = 0x7f7fffff7f7fffff;
      auVar85._12_4_ = 0x7f7fffff;
      auVar89._8_4_ = 0xff7fffff;
      auVar89._0_8_ = 0xff7fffffff7fffff;
      auVar89._12_4_ = 0xff7fffff;
      auVar96._8_4_ = 0x7fffffff;
      auVar96._0_8_ = 0x7fffffff7fffffff;
      auVar96._12_4_ = 0x7fffffff;
      auVar106._8_4_ = 0x3f800001;
      auVar106._0_8_ = 0x3f8000013f800001;
      auVar106._12_4_ = 0x3f800001;
      do {
        *(undefined8 *)(uVar47 + lVar38 * 8) = *(undefined8 *)(pfVar43 + -0x15);
        fVar73 = *pfVar43;
        fVar107 = ((BBox1f *)(pfVar43 + -1))->lower;
        fVar113 = 1.0 / (fVar73 - fVar107);
        fVar101 = fVar113 * -fVar107;
        auVar64 = vshufps_avx(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101),0);
        auVar66 = vshufps_avx(ZEXT416((uint)(1.0 - fVar101)),ZEXT416((uint)(1.0 - fVar101)),0);
        auVar81._0_4_ = pfVar43[-9] * auVar64._0_4_ + pfVar43[-0x11] * auVar66._0_4_;
        auVar81._4_4_ = pfVar43[-8] * auVar64._4_4_ + pfVar43[-0x10] * auVar66._4_4_;
        auVar81._8_4_ = pfVar43[-7] * auVar64._8_4_ + pfVar43[-0xf] * auVar66._8_4_;
        auVar81._12_4_ = pfVar43[-6] * auVar64._12_4_ + pfVar43[-0xe] * auVar66._12_4_;
        auVar120._0_4_ = pfVar43[-5] * auVar64._0_4_ + pfVar43[-0xd] * auVar66._0_4_;
        auVar120._4_4_ = pfVar43[-4] * auVar64._4_4_ + pfVar43[-0xc] * auVar66._4_4_;
        auVar120._8_4_ = pfVar43[-3] * auVar64._8_4_ + pfVar43[-0xb] * auVar66._8_4_;
        auVar120._12_4_ = pfVar43[-2] * auVar64._12_4_ + pfVar43[-10] * auVar66._12_4_;
        fVar113 = (1.0 - fVar107) * fVar113;
        auVar64 = vshufps_avx(ZEXT416((uint)fVar113),ZEXT416((uint)fVar113),0);
        auVar66 = vshufps_avx(ZEXT416((uint)(1.0 - fVar113)),ZEXT416((uint)(1.0 - fVar113)),0);
        auVar124._0_4_ = pfVar43[-9] * auVar64._0_4_ + pfVar43[-0x11] * auVar66._0_4_;
        auVar124._4_4_ = pfVar43[-8] * auVar64._4_4_ + pfVar43[-0x10] * auVar66._4_4_;
        auVar124._8_4_ = pfVar43[-7] * auVar64._8_4_ + pfVar43[-0xf] * auVar66._8_4_;
        auVar124._12_4_ = pfVar43[-6] * auVar64._12_4_ + pfVar43[-0xe] * auVar66._12_4_;
        auVar116._0_4_ = pfVar43[-5] * auVar64._0_4_ + pfVar43[-0xd] * auVar66._0_4_;
        auVar116._4_4_ = pfVar43[-4] * auVar64._4_4_ + pfVar43[-0xc] * auVar66._4_4_;
        auVar116._8_4_ = pfVar43[-3] * auVar64._8_4_ + pfVar43[-0xb] * auVar66._8_4_;
        auVar116._12_4_ = pfVar43[-2] * auVar64._12_4_ + pfVar43[-10] * auVar66._12_4_;
        auVar79 = vminps_avx(auVar81,auVar85);
        auVar66 = vmaxps_avx(auVar120,auVar89);
        auVar76 = vminps_avx(auVar124,auVar85);
        auVar65 = vmaxps_avx(auVar116,auVar89);
        auVar64 = vandps_avx(auVar79,auVar96);
        auVar125._0_4_ = auVar64._0_4_ * 4.7683716e-07;
        auVar125._4_4_ = auVar64._4_4_ * 4.7683716e-07;
        auVar125._8_4_ = auVar64._8_4_ * 4.7683716e-07;
        auVar125._12_4_ = auVar64._12_4_ * 4.7683716e-07;
        auVar79 = vsubps_avx(auVar79,auVar125);
        auVar64 = vandps_avx(auVar66,auVar96);
        auVar121._0_4_ = auVar66._0_4_ + auVar64._0_4_ * 4.7683716e-07;
        auVar121._4_4_ = auVar66._4_4_ + auVar64._4_4_ * 4.7683716e-07;
        auVar121._8_4_ = auVar66._8_4_ + auVar64._8_4_ * 4.7683716e-07;
        auVar121._12_4_ = auVar66._12_4_ + auVar64._12_4_ * 4.7683716e-07;
        auVar64 = vandps_avx(auVar76,auVar96);
        auVar126._0_4_ = auVar64._0_4_ * 4.7683716e-07;
        auVar126._4_4_ = auVar64._4_4_ * 4.7683716e-07;
        auVar126._8_4_ = auVar64._8_4_ * 4.7683716e-07;
        auVar126._12_4_ = auVar64._12_4_ * 4.7683716e-07;
        auVar66 = vsubps_avx(auVar76,auVar126);
        auVar64 = vandps_avx(auVar65,auVar96);
        *(int *)(uVar47 + 0x40 + lVar38 * 4) = auVar79._0_4_;
        uVar6 = vextractps_avx(auVar79,1);
        *(undefined4 *)(uVar47 + 0x80 + lVar38 * 4) = uVar6;
        auVar117._0_4_ = auVar65._0_4_ + auVar64._0_4_ * 4.7683716e-07;
        auVar117._4_4_ = auVar65._4_4_ + auVar64._4_4_ * 4.7683716e-07;
        auVar117._8_4_ = auVar65._8_4_ + auVar64._8_4_ * 4.7683716e-07;
        auVar117._12_4_ = auVar65._12_4_ + auVar64._12_4_ * 4.7683716e-07;
        uVar6 = vextractps_avx(auVar79,2);
        *(undefined4 *)(uVar47 + 0xc0 + lVar38 * 4) = uVar6;
        *(float *)(uVar47 + 0x60 + lVar38 * 4) = auVar121._0_4_;
        uVar6 = vextractps_avx(auVar121,1);
        *(undefined4 *)(uVar47 + 0xa0 + lVar38 * 4) = uVar6;
        auVar64 = vsubps_avx(auVar66,auVar79);
        uVar6 = vextractps_avx(auVar121,2);
        *(undefined4 *)(uVar47 + 0xe0 + lVar38 * 4) = uVar6;
        *(int *)(uVar47 + 0x100 + lVar38 * 4) = auVar64._0_4_;
        uVar6 = vextractps_avx(auVar64,1);
        *(undefined4 *)(uVar47 + 0x140 + lVar38 * 4) = uVar6;
        auVar66 = vsubps_avx(auVar117,auVar121);
        uVar6 = vextractps_avx(auVar64,2);
        *(undefined4 *)(uVar47 + 0x180 + lVar38 * 4) = uVar6;
        *(int *)(uVar47 + 0x120 + lVar38 * 4) = auVar66._0_4_;
        uVar6 = vextractps_avx(auVar66,1);
        *(undefined4 *)(uVar47 + 0x160 + lVar38 * 4) = uVar6;
        uVar6 = vextractps_avx(auVar66,2);
        *(undefined4 *)(uVar47 + 0x1a0 + lVar38 * 4) = uVar6;
        *(float *)(uVar47 + 0x1c0 + lVar38 * 4) = fVar107;
        auVar64 = vcmpss_avx(ZEXT416((uint)fVar73),SUB6416(ZEXT464(0x3f800000),0),0);
        auVar64 = vblendvps_avx(ZEXT416((uint)fVar73),auVar106,auVar64);
        *(int *)(uVar47 + 0x1e0 + lVar38 * 4) = auVar64._0_4_;
        lVar38 = lVar38 + 1;
        pfVar43 = pfVar43 + 0x18;
      } while (local_848 != lVar38);
    }
    uVar47 = (ulong)(uint)local_1e08._0_4_;
    fVar73 = (float)local_1e38._0_4_;
    fVar107 = (float)local_1e38._4_4_;
    fVar101 = fStack_1e30;
    fVar113 = fStack_1e2c;
    pBVar135 = this;
  }
  uVar27 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
  uVar26 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if ((char)uVar47 == '\0') {
    (local_1de0->ref).ptr = uVar58 | (ulong)pcVar46;
    *(undefined8 *)&(local_1de0->lbounds).bounds0.lower.field_0 = local_1db8._0_8_;
    *(undefined8 *)((long)&(local_1de0->lbounds).bounds0.lower.field_0 + 8) = local_1db8._8_8_;
    *(undefined8 *)&(local_1de0->lbounds).bounds0.upper.field_0 = local_1da8._0_8_;
    *(undefined8 *)((long)&(local_1de0->lbounds).bounds0.upper.field_0 + 8) = local_1da8._8_8_;
    (local_1de0->lbounds).bounds1.lower.field_0.m128[0] = fVar73;
    (local_1de0->lbounds).bounds1.lower.field_0.m128[1] = fVar107;
    (local_1de0->lbounds).bounds1.lower.field_0.m128[2] = fVar101;
    (local_1de0->lbounds).bounds1.lower.field_0.m128[3] = fVar113;
    uVar51 = local_1e48._0_8_;
    uVar72 = local_1e48._8_8_;
  }
  else {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    geomID.field_0.i[2] = 0x7f800000;
    geomID.field_0.v[0] = 0x7f8000007f800000;
    geomID.field_0.i[3] = 0x7f800000;
    local_1b18._0_8_ = 0xff800000ff800000;
    local_1b18._8_8_ = 0xff800000ff800000;
    uStack_1b08 = 0x7f8000007f800000;
    uStack_1b00 = 0x7f8000007f800000;
    local_1af8 = 0xff800000ff800000;
    uStack_1af0 = 0xff800000ff800000;
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin < 0xc00) {
      v2.field_0.v[1] = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      v2.field_0.v[0] = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&left,(anon_class_16_2_aeee9775 *)&vSplitPos,
                 (range<unsigned_long> *)&v2);
    }
    else {
      v2.field_0.v[1]._4_2_ = 0x401;
      auStack_1bf8._0_8_ = 0;
      auStack_1bf8._8_8_ = 0;
      aStack_1bd8._0_8_ = 8;
      tbb::detail::r1::initialize((task_group_context *)&v2);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           uVar27;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           uVar26;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::TriangleMesh>>(embree::avx::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&left,(d1 *)&right,(blocked_range<unsigned_long> *)&geomID
                 ,(LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,(anon_class_1_0_00000001 *)&v2,
                 (task_group_context *)pBVar135);
      cVar29 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&v2);
      if (cVar29 != '\0') {
        prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar36,"task cancelled");
        __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&v2);
    }
    (local_1de0->ref).ptr = uVar58 | (ulong)pcVar46;
    *(undefined8 *)&(local_1de0->lbounds).bounds0.lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
    *(undefined8 *)((long)&(local_1de0->lbounds).bounds0.lower.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_;
    *(ulong *)&(local_1de0->lbounds).bounds0.upper.field_0 =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[1],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[0]);
    *(ulong *)((long)&(local_1de0->lbounds).bounds0.upper.field_0 + 8) =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[2]);
    *(ulong *)&(local_1de0->lbounds).bounds1.lower.field_0 =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[1],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[0]);
    *(ulong *)((long)&(local_1de0->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[2]);
    uVar51 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0.m128[1],
                      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0.m128[0]);
    uVar72 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0.m128[3],
                      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0.m128[2]);
  }
  *(undefined8 *)&(local_1de0->lbounds).bounds1.upper.field_0 = uVar51;
  *(undefined8 *)((long)&(local_1de0->lbounds).bounds1.upper.field_0 + 8) = uVar72;
  local_1de0->dt = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  if (local_848 == 0) {
    return local_1de0;
  }
  uVar47 = 0;
  do {
    pBVar11 = local_8c8[uVar47];
    pBVar37 = pBVar11 + 1;
    *pBVar37 = (BBox1f)((long)*pBVar37 + -1);
    if (*pBVar37 == (BBox1f)0x0) {
      BVar39 = *pBVar11;
      if (BVar39 != (BBox1f)0x0) {
        lVar38 = *(long *)((long)BVar39 + 0x18);
        pvVar32 = *(void **)((long)BVar39 + 0x20);
        if (pvVar32 != (void *)0x0) {
          if ((ulong)(lVar38 * 0x50) < 0x1c00000) {
            alignedFree(pvVar32);
          }
          else {
            os_free(pvVar32,lVar38 * 0x50,*(bool *)((long)BVar39 + 8));
          }
        }
        if (lVar38 != 0) {
          (**(code **)**(undefined8 **)BVar39)(*(undefined8 **)BVar39,lVar38 * -0x50,1);
        }
        *(undefined8 *)((long)BVar39 + 0x10) = 0;
        *(undefined8 *)((long)BVar39 + 0x18) = 0;
        *(undefined8 *)((long)BVar39 + 0x20) = 0;
      }
      operator_delete((void *)BVar39);
    }
    uVar47 = uVar47 + 1;
  } while (uVar47 < local_848);
  return local_1de0;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }